

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx2::CurveNiMBIntersectorK<4,4>::
     occluded_n<embree::avx2::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  undefined1 (*pauVar3) [12];
  float *pfVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  Geometry *pGVar7;
  __int_type_conflict _Var8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  bool bVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [12];
  undefined1 auVar62 [12];
  uint uVar63;
  uint uVar64;
  uint uVar65;
  int iVar66;
  uint uVar67;
  ulong uVar68;
  long lVar70;
  byte bVar71;
  uint uVar72;
  ulong uVar73;
  ulong uVar74;
  long lVar75;
  bool bVar76;
  float fVar77;
  vint4 bi_2;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined4 uVar78;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [32];
  float fVar94;
  vint4 bi_1;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  float fVar114;
  float fVar134;
  float fVar135;
  vint4 bi;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar136;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  float fVar137;
  float fVar138;
  float fVar155;
  float fVar156;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  float fVar157;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  vint4 ai_2;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  float fVar177;
  float fVar195;
  vint4 ai_1;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  float fVar196;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [32];
  float fVar197;
  undefined8 uVar198;
  float fVar223;
  vint4 ai;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar215 [16];
  float fVar225;
  float fVar226;
  float fVar227;
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  float fVar222;
  float fVar224;
  undefined1 auVar221 [32];
  float fVar228;
  float fVar245;
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [32];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar254 [16];
  undefined1 auVar267 [32];
  float fVar268;
  float fVar279;
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [32];
  float fVar280;
  float fVar291;
  float fVar292;
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  float fVar293;
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  float fVar294;
  float fVar295;
  float fVar296;
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [32];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar323 [16];
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  float fVar332;
  float fVar343;
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [32];
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  bool local_659;
  undefined1 local_658 [16];
  undefined1 local_648 [8];
  undefined8 uStack_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  float local_628;
  float fStack_624;
  float fStack_620;
  float fStack_61c;
  float local_618;
  float fStack_614;
  float fStack_610;
  undefined1 local_608 [8];
  float fStack_600;
  float fStack_5fc;
  undefined1 local_5d8 [8];
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  float fStack_5c0;
  float fStack_5bc;
  float local_5b8;
  float fStack_5b4;
  undefined1 local_598 [8];
  float fStack_590;
  float fStack_58c;
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  float local_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float local_4a8;
  float fStack_4a4;
  float fStack_4a0;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 *local_468;
  Primitive *local_460;
  undefined1 local_458 [8];
  float fStack_450;
  float fStack_44c;
  undefined1 local_448 [8];
  float fStack_440;
  float fStack_43c;
  undefined1 local_438 [16];
  undefined1 local_428 [16];
  undefined1 local_418 [16];
  undefined1 local_408 [16];
  undefined1 local_3f8 [8];
  float fStack_3f0;
  float fStack_3ec;
  undefined1 local_3e8 [32];
  uint auStack_3c8 [4];
  RTCFilterFunctionNArguments local_3b8;
  undefined1 local_388 [32];
  undefined1 local_368 [8];
  float fStack_360;
  float fStack_35c;
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  uint local_328;
  uint uStack_324;
  uint uStack_320;
  uint uStack_31c;
  uint local_318;
  uint uStack_314;
  uint uStack_310;
  uint uStack_30c;
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [32];
  uint uStack_248;
  float afStack_244 [7];
  RTCHitN local_228 [16];
  undefined1 local_218 [16];
  undefined4 local_208;
  undefined4 uStack_204;
  undefined4 uStack_200;
  undefined4 uStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [16];
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined1 local_1c8 [16];
  uint local_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  uint uStack_1a0;
  uint uStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  undefined1 local_158 [32];
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar69;
  undefined1 auVar152 [32];
  
  PVar6 = prim[1];
  uVar68 = (ulong)(byte)PVar6;
  lVar70 = uVar68 * 0x25;
  fVar77 = *(float *)(prim + lVar70 + 0x12);
  auVar14 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar14 = vinsertps_avx(auVar14,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar15 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar15 = vinsertps_avx(auVar15,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar14 = vsubps_avx(auVar14,*(undefined1 (*) [16])(prim + lVar70 + 6));
  auVar79._0_4_ = fVar77 * auVar14._0_4_;
  auVar79._4_4_ = fVar77 * auVar14._4_4_;
  auVar79._8_4_ = fVar77 * auVar14._8_4_;
  auVar79._12_4_ = fVar77 * auVar14._12_4_;
  auVar115._0_4_ = fVar77 * auVar15._0_4_;
  auVar115._4_4_ = fVar77 * auVar15._4_4_;
  auVar115._8_4_ = fVar77 * auVar15._8_4_;
  auVar115._12_4_ = fVar77 * auVar15._12_4_;
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 4 + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 5 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 6 + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0xf + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar184 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar68 + 6)));
  auVar184 = vcvtdq2ps_avx(auVar184);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0x1a + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar181 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0x1b + 6)));
  auVar181 = vcvtdq2ps_avx(auVar181);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0x1c + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar333._4_4_ = auVar115._0_4_;
  auVar333._0_4_ = auVar115._0_4_;
  auVar333._8_4_ = auVar115._0_4_;
  auVar333._12_4_ = auVar115._0_4_;
  auVar21 = vshufps_avx(auVar115,auVar115,0x55);
  auVar118 = vshufps_avx(auVar115,auVar115,0xaa);
  fVar77 = auVar118._0_4_;
  auVar281._0_4_ = fVar77 * auVar16._0_4_;
  fVar177 = auVar118._4_4_;
  auVar281._4_4_ = fVar177 * auVar16._4_4_;
  fVar195 = auVar118._8_4_;
  auVar281._8_4_ = fVar195 * auVar16._8_4_;
  fVar94 = auVar118._12_4_;
  auVar281._12_4_ = fVar94 * auVar16._12_4_;
  auVar269._0_4_ = auVar184._0_4_ * fVar77;
  auVar269._4_4_ = auVar184._4_4_ * fVar177;
  auVar269._8_4_ = auVar184._8_4_ * fVar195;
  auVar269._12_4_ = auVar184._12_4_ * fVar94;
  auVar246._0_4_ = auVar20._0_4_ * fVar77;
  auVar246._4_4_ = auVar20._4_4_ * fVar177;
  auVar246._8_4_ = auVar20._8_4_ * fVar195;
  auVar246._12_4_ = auVar20._12_4_ * fVar94;
  auVar118 = vfmadd231ps_fma(auVar281,auVar21,auVar15);
  auVar140 = vfmadd231ps_fma(auVar269,auVar21,auVar18);
  auVar21 = vfmadd231ps_fma(auVar246,auVar181,auVar21);
  auVar91 = vfmadd231ps_fma(auVar118,auVar333,auVar14);
  auVar140 = vfmadd231ps_fma(auVar140,auVar333,auVar17);
  auVar81 = vfmadd231ps_fma(auVar21,auVar19,auVar333);
  auVar334._4_4_ = auVar79._0_4_;
  auVar334._0_4_ = auVar79._0_4_;
  auVar334._8_4_ = auVar79._0_4_;
  auVar334._12_4_ = auVar79._0_4_;
  auVar21 = vshufps_avx(auVar79,auVar79,0x55);
  auVar118 = vshufps_avx(auVar79,auVar79,0xaa);
  fVar77 = auVar118._0_4_;
  auVar257._0_4_ = fVar77 * auVar16._0_4_;
  fVar177 = auVar118._4_4_;
  auVar257._4_4_ = fVar177 * auVar16._4_4_;
  fVar195 = auVar118._8_4_;
  auVar257._8_4_ = fVar195 * auVar16._8_4_;
  fVar94 = auVar118._12_4_;
  auVar257._12_4_ = fVar94 * auVar16._12_4_;
  auVar95._0_4_ = auVar184._0_4_ * fVar77;
  auVar95._4_4_ = auVar184._4_4_ * fVar177;
  auVar95._8_4_ = auVar184._8_4_ * fVar195;
  auVar95._12_4_ = auVar184._12_4_ * fVar94;
  auVar80._0_4_ = auVar20._0_4_ * fVar77;
  auVar80._4_4_ = auVar20._4_4_ * fVar177;
  auVar80._8_4_ = auVar20._8_4_ * fVar195;
  auVar80._12_4_ = auVar20._12_4_ * fVar94;
  auVar15 = vfmadd231ps_fma(auVar257,auVar21,auVar15);
  auVar16 = vfmadd231ps_fma(auVar95,auVar21,auVar18);
  auVar18 = vfmadd231ps_fma(auVar80,auVar21,auVar181);
  auVar95 = vfmadd231ps_fma(auVar15,auVar334,auVar14);
  auVar96 = vfmadd231ps_fma(auVar16,auVar334,auVar17);
  auVar97 = vfmadd231ps_fma(auVar18,auVar334,auVar19);
  auVar335._8_4_ = 0x7fffffff;
  auVar335._0_8_ = 0x7fffffff7fffffff;
  auVar335._12_4_ = 0x7fffffff;
  auVar14 = vandps_avx(auVar91,auVar335);
  auVar199._8_4_ = 0x219392ef;
  auVar199._0_8_ = 0x219392ef219392ef;
  auVar199._12_4_ = 0x219392ef;
  auVar14 = vcmpps_avx(auVar14,auVar199,1);
  auVar15 = vblendvps_avx(auVar91,auVar199,auVar14);
  auVar14 = vandps_avx(auVar140,auVar335);
  auVar14 = vcmpps_avx(auVar14,auVar199,1);
  auVar16 = vblendvps_avx(auVar140,auVar199,auVar14);
  auVar14 = vandps_avx(auVar81,auVar335);
  auVar14 = vcmpps_avx(auVar14,auVar199,1);
  auVar14 = vblendvps_avx(auVar81,auVar199,auVar14);
  auVar17 = vrcpps_avx(auVar15);
  auVar229._8_4_ = 0x3f800000;
  auVar229._0_8_ = &DAT_3f8000003f800000;
  auVar229._12_4_ = 0x3f800000;
  auVar15 = vfnmadd213ps_fma(auVar15,auVar17,auVar229);
  auVar91 = vfmadd132ps_fma(auVar15,auVar17,auVar17);
  auVar15 = vrcpps_avx(auVar16);
  auVar16 = vfnmadd213ps_fma(auVar16,auVar15,auVar229);
  auVar81 = vfmadd132ps_fma(auVar16,auVar15,auVar15);
  auVar15 = vrcpps_avx(auVar14);
  auVar14 = vfnmadd213ps_fma(auVar14,auVar15,auVar229);
  auVar79 = vfmadd132ps_fma(auVar14,auVar15,auVar15);
  fVar77 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar70 + 0x16)) *
           *(float *)(prim + lVar70 + 0x1a);
  auVar200._4_4_ = fVar77;
  auVar200._0_4_ = fVar77;
  auVar200._8_4_ = fVar77;
  auVar200._12_4_ = fVar77;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar68 * 7 + 6);
  auVar14 = vpmovsxwd_avx(auVar14);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar68 * 0xb + 6);
  auVar15 = vpmovsxwd_avx(auVar15);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar17 = vsubps_avx(auVar15,auVar14);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar68 * 9 + 6);
  auVar15 = vpmovsxwd_avx(auVar16);
  auVar80 = vfmadd213ps_fma(auVar17,auVar200,auVar14);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar68 * 0xd + 6);
  auVar16 = vpmovsxwd_avx(auVar17);
  auVar14 = vcvtdq2ps_avx(auVar15);
  auVar15 = vcvtdq2ps_avx(auVar16);
  auVar15 = vsubps_avx(auVar15,auVar14);
  auVar17 = vfmadd213ps_fma(auVar15,auVar200,auVar14);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar68 * 0x12 + 6);
  auVar14 = vpmovsxwd_avx(auVar18);
  auVar14 = vcvtdq2ps_avx(auVar14);
  uVar74 = (ulong)(uint)((int)(uVar68 * 5) << 2);
  auVar184._8_8_ = 0;
  auVar184._0_8_ = *(ulong *)(prim + uVar68 * 2 + uVar74 + 6);
  auVar15 = vpmovsxwd_avx(auVar184);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vsubps_avx(auVar15,auVar14);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar74 + 6);
  auVar15 = vpmovsxwd_avx(auVar19);
  auVar16 = vfmadd213ps_fma(auVar16,auVar200,auVar14);
  auVar14 = vcvtdq2ps_avx(auVar15);
  auVar181._8_8_ = 0;
  auVar181._0_8_ = *(ulong *)(prim + uVar68 * 0x18 + 6);
  auVar15 = vpmovsxwd_avx(auVar181);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar14);
  auVar18 = vfmadd213ps_fma(auVar15,auVar200,auVar14);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar68 * 0x1d + 6);
  auVar14 = vpmovsxwd_avx(auVar20);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar68 + (ulong)(byte)PVar6 * 0x20 + 6);
  auVar15 = vpmovsxwd_avx(auVar21);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar14);
  auVar184 = vfmadd213ps_fma(auVar15,auVar200,auVar14);
  auVar118._8_8_ = 0;
  auVar118._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar6 * 0x20 - uVar68) + 6);
  auVar14 = vpmovsxwd_avx(auVar118);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar140._8_8_ = 0;
  auVar140._0_8_ = *(ulong *)(prim + uVar68 * 0x23 + 6);
  auVar15 = vpmovsxwd_avx(auVar140);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar14);
  auVar15 = vfmadd213ps_fma(auVar15,auVar200,auVar14);
  auVar14 = vsubps_avx(auVar80,auVar95);
  auVar201._0_4_ = auVar91._0_4_ * auVar14._0_4_;
  auVar201._4_4_ = auVar91._4_4_ * auVar14._4_4_;
  auVar201._8_4_ = auVar91._8_4_ * auVar14._8_4_;
  auVar201._12_4_ = auVar91._12_4_ * auVar14._12_4_;
  auVar14 = vsubps_avx(auVar17,auVar95);
  auVar116._0_4_ = auVar91._0_4_ * auVar14._0_4_;
  auVar116._4_4_ = auVar91._4_4_ * auVar14._4_4_;
  auVar116._8_4_ = auVar91._8_4_ * auVar14._8_4_;
  auVar116._12_4_ = auVar91._12_4_ * auVar14._12_4_;
  auVar14 = vsubps_avx(auVar16,auVar96);
  auVar167._0_4_ = auVar81._0_4_ * auVar14._0_4_;
  auVar167._4_4_ = auVar81._4_4_ * auVar14._4_4_;
  auVar167._8_4_ = auVar81._8_4_ * auVar14._8_4_;
  auVar167._12_4_ = auVar81._12_4_ * auVar14._12_4_;
  auVar14 = vsubps_avx(auVar18,auVar96);
  auVar96._0_4_ = auVar81._0_4_ * auVar14._0_4_;
  auVar96._4_4_ = auVar81._4_4_ * auVar14._4_4_;
  auVar96._8_4_ = auVar81._8_4_ * auVar14._8_4_;
  auVar96._12_4_ = auVar81._12_4_ * auVar14._12_4_;
  auVar14 = vsubps_avx(auVar184,auVar97);
  auVar158._0_4_ = auVar79._0_4_ * auVar14._0_4_;
  auVar158._4_4_ = auVar79._4_4_ * auVar14._4_4_;
  auVar158._8_4_ = auVar79._8_4_ * auVar14._8_4_;
  auVar158._12_4_ = auVar79._12_4_ * auVar14._12_4_;
  auVar14 = vsubps_avx(auVar15,auVar97);
  auVar91._0_4_ = auVar79._0_4_ * auVar14._0_4_;
  auVar91._4_4_ = auVar79._4_4_ * auVar14._4_4_;
  auVar91._8_4_ = auVar79._8_4_ * auVar14._8_4_;
  auVar91._12_4_ = auVar79._12_4_ * auVar14._12_4_;
  auVar14 = vpminsd_avx(auVar201,auVar116);
  auVar15 = vpminsd_avx(auVar167,auVar96);
  auVar14 = vmaxps_avx(auVar14,auVar15);
  auVar15 = vpminsd_avx(auVar158,auVar91);
  uVar78 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar247._4_4_ = uVar78;
  auVar247._0_4_ = uVar78;
  auVar247._8_4_ = uVar78;
  auVar247._12_4_ = uVar78;
  auVar15 = vmaxps_avx(auVar15,auVar247);
  auVar14 = vmaxps_avx(auVar14,auVar15);
  local_308._0_4_ = auVar14._0_4_ * 0.99999964;
  local_308._4_4_ = auVar14._4_4_ * 0.99999964;
  local_308._8_4_ = auVar14._8_4_ * 0.99999964;
  local_308._12_4_ = auVar14._12_4_ * 0.99999964;
  auVar14 = vpmaxsd_avx(auVar201,auVar116);
  auVar15 = vpmaxsd_avx(auVar167,auVar96);
  auVar14 = vminps_avx(auVar14,auVar15);
  auVar15 = vpmaxsd_avx(auVar158,auVar91);
  uVar78 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar117._4_4_ = uVar78;
  auVar117._0_4_ = uVar78;
  auVar117._8_4_ = uVar78;
  auVar117._12_4_ = uVar78;
  auVar15 = vminps_avx(auVar15,auVar117);
  auVar14 = vminps_avx(auVar14,auVar15);
  auVar81._0_4_ = auVar14._0_4_ * 1.0000004;
  auVar81._4_4_ = auVar14._4_4_ * 1.0000004;
  auVar81._8_4_ = auVar14._8_4_ * 1.0000004;
  auVar81._12_4_ = auVar14._12_4_ * 1.0000004;
  auVar97._1_3_ = 0;
  auVar97[0] = PVar6;
  auVar97[4] = PVar6;
  auVar97._5_3_ = 0;
  auVar97[8] = PVar6;
  auVar97._9_3_ = 0;
  auVar97[0xc] = PVar6;
  auVar97._13_3_ = 0;
  auVar15 = vpcmpgtd_avx(auVar97,_DAT_01ff0cf0);
  auVar14 = vcmpps_avx(local_308,auVar81,2);
  auVar14 = vandps_avx(auVar14,auVar15);
  uVar63 = vmovmskps_avx(auVar14);
  local_659 = uVar63 != 0;
  if (uVar63 == 0) {
    return local_659;
  }
  uVar63 = uVar63 & 0xff;
  auVar93._16_16_ = mm_lookupmask_ps._240_16_;
  auVar93._0_16_ = mm_lookupmask_ps._240_16_;
  local_268 = vblendps_avx(auVar93,ZEXT832(0) << 0x20,0x80);
  local_468 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_460 = prim;
LAB_017ea434:
  lVar70 = 0;
  for (uVar68 = (ulong)uVar63; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x8000000000000000) {
    lVar70 = lVar70 + 1;
  }
  uVar67 = *(uint *)(local_460 + 2);
  local_328 = *(uint *)(local_460 + lVar70 * 4 + 6);
  pGVar7 = (context->scene->geometries).items[uVar67].ptr;
  fVar77 = (pGVar7->time_range).lower;
  fVar195 = pGVar7->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar77) / ((pGVar7->time_range).upper - fVar77));
  auVar14 = vroundss_avx(ZEXT416((uint)fVar195),ZEXT416((uint)fVar195),9);
  auVar14 = vminss_avx(auVar14,ZEXT416((uint)(pGVar7->fnumTimeSegments + -1.0)));
  auVar21 = vmaxss_avx(ZEXT816(0),auVar14);
  uVar68 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           (ulong)local_328 *
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var8 = pGVar7[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar75 = (long)(int)auVar21._0_4_ * 0x38;
  lVar9 = *(long *)(_Var8 + lVar75);
  lVar10 = *(long *)(_Var8 + 0x10 + lVar75);
  auVar14 = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar68);
  lVar70 = uVar68 + 1;
  auVar15 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar70);
  lVar1 = uVar68 + 2;
  auVar16 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar1);
  lVar2 = uVar68 + 3;
  pauVar3 = (undefined1 (*) [12])(lVar9 + lVar10 * lVar2);
  auVar61 = *pauVar3;
  fVar77 = *(float *)pauVar3[1];
  lVar9 = *(long *)&pGVar7[4].fnumTimeSegments;
  lVar10 = *(long *)(lVar9 + lVar75);
  lVar11 = *(long *)(lVar9 + 0x10 + lVar75);
  auVar17 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar68);
  auVar18 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar70);
  auVar184 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  pfVar4 = (float *)(lVar10 + lVar11 * lVar2);
  fVar177 = *pfVar4;
  fVar94 = pfVar4[1];
  fVar196 = pfVar4[2];
  fVar138 = pfVar4[3];
  auVar248._0_4_ = *(float *)*pauVar3 * 0.0;
  auVar248._4_4_ = *(float *)(*pauVar3 + 4) * 0.0;
  auVar248._8_4_ = *(float *)(*pauVar3 + 8) * 0.0;
  auVar248._12_4_ = fVar77 * 0.0;
  auVar336._8_4_ = 0x3f000000;
  auVar336._0_8_ = 0x3f0000003f000000;
  auVar336._12_4_ = 0x3f000000;
  auVar19 = vfmadd231ps_fma(auVar248,auVar16,auVar336);
  auVar19 = vfmadd231ps_fma(auVar19,auVar15,ZEXT816(0) << 0x40);
  auVar116 = vfnmadd231ps_fma(auVar19,auVar14,auVar336);
  auVar202._8_4_ = 0x80000000;
  auVar202._0_8_ = 0x8000000080000000;
  auVar202._12_4_ = 0x80000000;
  auVar249._0_4_ = fVar177 * -0.0;
  auVar249._4_4_ = fVar94 * -0.0;
  auVar249._8_4_ = fVar196 * -0.0;
  auVar249._12_4_ = fVar138 * -0.0;
  auVar19 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar184,auVar249);
  auVar230._0_4_ = auVar18._0_4_ + auVar19._0_4_;
  auVar230._4_4_ = auVar18._4_4_ + auVar19._4_4_;
  auVar230._8_4_ = auVar18._8_4_ + auVar19._8_4_;
  auVar230._12_4_ = auVar18._12_4_ + auVar19._12_4_;
  auVar19 = vfmadd231ps_fma(auVar230,auVar17,auVar202);
  auVar118 = ZEXT816(0) << 0x20;
  auVar203._0_4_ = fVar177 * 0.0;
  auVar203._4_4_ = fVar94 * 0.0;
  auVar203._8_4_ = fVar196 * 0.0;
  auVar203._12_4_ = fVar138 * 0.0;
  auVar181 = vfmadd231ps_fma(auVar203,auVar184,auVar336);
  auVar181 = vfmadd231ps_fma(auVar181,auVar18,auVar118);
  auVar20 = vfnmadd231ps_fma(auVar181,auVar17,auVar336);
  auVar319._0_4_ = *(float *)*pauVar3 * 0.5;
  auVar319._4_4_ = *(float *)(*pauVar3 + 4) * 0.5;
  auVar319._8_4_ = *(float *)(*pauVar3 + 8) * 0.5;
  auVar319._12_4_ = fVar77 * 0.5;
  auVar181 = vfmadd231ps_fma(auVar319,auVar118,auVar16);
  auVar181 = vfnmadd231ps_fma(auVar181,auVar336,auVar15);
  auVar91 = vfmadd231ps_fma(auVar181,auVar118,auVar14);
  auVar250._0_4_ = auVar249._0_4_ + auVar184._0_4_;
  auVar250._4_4_ = auVar249._4_4_ + auVar184._4_4_;
  auVar250._8_4_ = auVar249._8_4_ + auVar184._8_4_;
  auVar250._12_4_ = auVar249._12_4_ + auVar184._12_4_;
  auVar181 = vfmadd231ps_fma(auVar250,auVar18,auVar118);
  auVar181 = vfmadd231ps_fma(auVar181,auVar17,auVar202);
  auVar178._0_4_ = fVar177 * 0.5;
  auVar178._4_4_ = fVar94 * 0.5;
  auVar178._8_4_ = fVar196 * 0.5;
  auVar178._12_4_ = fVar138 * 0.5;
  auVar184 = vfmadd231ps_fma(auVar178,auVar118,auVar184);
  auVar18 = vfnmadd231ps_fma(auVar184,auVar336,auVar18);
  auVar184 = vfmadd231ps_fma(auVar18,auVar118,auVar17);
  auVar17 = vshufps_avx(auVar116,auVar116,0xc9);
  auVar18 = vshufps_avx(auVar19,auVar19,0xc9);
  fVar280 = auVar116._0_4_;
  auVar98._0_4_ = fVar280 * auVar18._0_4_;
  fVar197 = auVar116._4_4_;
  auVar98._4_4_ = fVar197 * auVar18._4_4_;
  fVar291 = auVar116._8_4_;
  auVar98._8_4_ = fVar291 * auVar18._8_4_;
  fVar222 = auVar116._12_4_;
  auVar98._12_4_ = fVar222 * auVar18._12_4_;
  auVar81 = vfmsub231ps_fma(auVar98,auVar17,auVar19);
  auVar18 = vshufps_avx(auVar20,auVar20,0xc9);
  auVar99._0_4_ = fVar280 * auVar18._0_4_;
  auVar99._4_4_ = fVar197 * auVar18._4_4_;
  auVar99._8_4_ = fVar291 * auVar18._8_4_;
  auVar99._12_4_ = fVar222 * auVar18._12_4_;
  auVar79 = vfmsub231ps_fma(auVar99,auVar17,auVar20);
  auVar17 = vshufps_avx(auVar91,auVar91,0xc9);
  auVar18 = vshufps_avx(auVar181,auVar181,0xc9);
  fVar294 = auVar91._0_4_;
  auVar100._0_4_ = fVar294 * auVar18._0_4_;
  fVar225 = auVar91._4_4_;
  auVar100._4_4_ = fVar225 * auVar18._4_4_;
  fVar295 = auVar91._8_4_;
  auVar100._8_4_ = fVar295 * auVar18._8_4_;
  fVar226 = auVar91._12_4_;
  auVar100._12_4_ = fVar226 * auVar18._12_4_;
  auVar80 = vfmsub231ps_fma(auVar100,auVar17,auVar181);
  auVar18 = vshufps_avx(auVar184,auVar184,0xc9);
  auVar101._0_4_ = fVar294 * auVar18._0_4_;
  auVar101._4_4_ = fVar225 * auVar18._4_4_;
  auVar101._8_4_ = fVar295 * auVar18._8_4_;
  auVar101._12_4_ = fVar226 * auVar18._12_4_;
  auVar95 = vfmsub231ps_fma(auVar101,auVar17,auVar184);
  lVar10 = *(long *)(_Var8 + 0x38 + lVar75);
  lVar11 = *(long *)(_Var8 + 0x48 + lVar75);
  auVar17 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar70);
  auVar18 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  pauVar3 = (undefined1 (*) [12])(lVar10 + lVar11 * lVar2);
  auVar62 = *pauVar3;
  fVar138 = *(float *)pauVar3[1];
  lVar12 = *(long *)(lVar9 + 0x38 + lVar75);
  lVar9 = *(long *)(lVar9 + 0x48 + lVar75);
  auVar297._0_4_ = *(float *)*pauVar3 * 0.0;
  auVar297._4_4_ = *(float *)(*pauVar3 + 4) * 0.0;
  auVar297._8_4_ = *(float *)(*pauVar3 + 8) * 0.0;
  auVar297._12_4_ = fVar138 * 0.0;
  auVar184 = vfmadd231ps_fma(auVar297,auVar18,auVar336);
  auVar19 = vfmadd231ps_fma(auVar184,auVar17,ZEXT816(0) << 0x20);
  auVar184 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar68);
  auVar117 = vfnmadd231ps_fma(auVar19,auVar184,auVar336);
  auVar19 = *(undefined1 (*) [16])(lVar12 + lVar1 * lVar9);
  pfVar4 = (float *)(lVar12 + lVar9 * lVar2);
  fVar177 = *pfVar4;
  fVar94 = pfVar4[1];
  fVar196 = pfVar4[2];
  fVar114 = pfVar4[3];
  auVar139._0_4_ = fVar177 * -0.0;
  auVar139._4_4_ = fVar94 * -0.0;
  auVar139._8_4_ = fVar196 * -0.0;
  auVar139._12_4_ = fVar114 * -0.0;
  auVar20 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar19,auVar139);
  auVar181 = *(undefined1 (*) [16])(lVar12 + lVar70 * lVar9);
  auVar179._0_4_ = auVar181._0_4_ + auVar20._0_4_;
  auVar179._4_4_ = auVar181._4_4_ + auVar20._4_4_;
  auVar179._8_4_ = auVar181._8_4_ + auVar20._8_4_;
  auVar179._12_4_ = auVar181._12_4_ + auVar20._12_4_;
  auVar20 = *(undefined1 (*) [16])(lVar12 + uVar68 * lVar9);
  auVar140 = vfmadd231ps_fma(auVar179,auVar20,auVar202);
  auVar118 = vshufps_avx(auVar140,auVar140,0xc9);
  fVar292 = auVar117._0_4_;
  auVar82._0_4_ = fVar292 * auVar118._0_4_;
  fVar223 = auVar117._4_4_;
  auVar82._4_4_ = fVar223 * auVar118._4_4_;
  fVar293 = auVar117._8_4_;
  auVar82._8_4_ = fVar293 * auVar118._8_4_;
  fVar224 = auVar117._12_4_;
  auVar82._12_4_ = fVar224 * auVar118._12_4_;
  auVar118 = vshufps_avx(auVar117,auVar117,0xc9);
  auVar96 = vfmsub231ps_fma(auVar82,auVar118,auVar140);
  auVar83._0_4_ = fVar177 * 0.0;
  auVar83._4_4_ = fVar94 * 0.0;
  auVar83._8_4_ = fVar196 * 0.0;
  auVar83._12_4_ = fVar114 * 0.0;
  auVar159._8_4_ = 0x3f000000;
  auVar159._0_8_ = 0x3f0000003f000000;
  auVar159._12_4_ = 0x3f000000;
  auVar140 = vfmadd231ps_fma(auVar83,auVar19,auVar159);
  auVar140 = vfmadd231ps_fma(auVar140,auVar181,ZEXT816(0) << 0x20);
  auVar97 = vfnmadd231ps_fma(auVar140,auVar20,auVar159);
  auVar140 = vshufps_avx(auVar97,auVar97,0xc9);
  auVar180._0_4_ = fVar292 * auVar140._0_4_;
  auVar180._4_4_ = fVar223 * auVar140._4_4_;
  auVar180._8_4_ = fVar293 * auVar140._8_4_;
  auVar180._12_4_ = fVar224 * auVar140._12_4_;
  auVar97 = vfmsub231ps_fma(auVar180,auVar118,auVar97);
  auVar84._0_4_ = auVar19._0_4_ + auVar139._0_4_;
  auVar84._4_4_ = auVar19._4_4_ + auVar139._4_4_;
  auVar84._8_4_ = auVar19._8_4_ + auVar139._8_4_;
  auVar84._12_4_ = auVar19._12_4_ + auVar139._12_4_;
  auVar102._0_4_ = fVar177 * 0.5;
  auVar102._4_4_ = fVar94 * 0.5;
  auVar102._8_4_ = fVar196 * 0.5;
  auVar102._12_4_ = fVar114 * 0.5;
  auVar140 = ZEXT416(0) << 0x20;
  auVar19 = vfmadd231ps_fma(auVar102,auVar140,auVar19);
  auVar118 = vfmadd231ps_fma(auVar84,auVar181,auVar140);
  auVar19 = vfnmadd231ps_fma(auVar19,auVar159,auVar181);
  auVar181 = vfmadd231ps_fma(auVar118,auVar20,auVar202);
  auVar20 = vfmadd231ps_fma(auVar19,auVar140,auVar20);
  auVar344._0_4_ = *(float *)*pauVar3 * 0.5;
  auVar344._4_4_ = *(float *)(*pauVar3 + 4) * 0.5;
  auVar344._8_4_ = *(float *)(*pauVar3 + 8) * 0.5;
  auVar344._12_4_ = fVar138 * 0.5;
  auVar19 = vfmadd231ps_fma(auVar344,auVar140,auVar18);
  auVar19 = vfnmadd231ps_fma(auVar19,auVar159,auVar17);
  auVar118 = vfmadd231ps_fma(auVar19,auVar140,auVar184);
  auVar52._12_4_ = 0;
  auVar52._0_12_ = ZEXT812(0);
  auVar19 = vshufps_avx(auVar181,auVar181,0xc9);
  fVar296 = auVar118._0_4_;
  auVar141._0_4_ = fVar296 * auVar19._0_4_;
  fVar227 = auVar118._4_4_;
  auVar141._4_4_ = fVar227 * auVar19._4_4_;
  fVar228 = auVar118._8_4_;
  auVar141._8_4_ = fVar228 * auVar19._8_4_;
  fVar245 = auVar118._12_4_;
  auVar141._12_4_ = fVar245 * auVar19._12_4_;
  auVar19 = vshufps_avx(auVar118,auVar118,0xc9);
  auVar115 = vfmsub231ps_fma(auVar141,auVar19,auVar181);
  auVar181 = vshufps_avx(auVar20,auVar20,0xc9);
  auVar85._0_4_ = fVar296 * auVar181._0_4_;
  auVar85._4_4_ = fVar227 * auVar181._4_4_;
  auVar85._8_4_ = fVar228 * auVar181._8_4_;
  auVar85._12_4_ = fVar245 * auVar181._12_4_;
  auVar257 = vfmsub231ps_fma(auVar85,auVar19,auVar20);
  fVar195 = fVar195 - auVar21._0_4_;
  local_618 = auVar61._0_4_;
  fStack_614 = auVar61._4_4_;
  fStack_610 = auVar61._8_4_;
  auVar86._0_4_ = local_618 * -0.0;
  auVar86._4_4_ = fStack_614 * -0.0;
  auVar86._8_4_ = fStack_610 * -0.0;
  auVar86._12_4_ = fVar77 * -0.0;
  auVar19 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar16,auVar86);
  auVar160._0_4_ = auVar16._0_4_ + auVar86._0_4_;
  auVar160._4_4_ = auVar16._4_4_ + auVar86._4_4_;
  auVar160._8_4_ = auVar16._8_4_ + auVar86._8_4_;
  auVar160._12_4_ = auVar16._12_4_ + auVar86._12_4_;
  auVar251._0_4_ = auVar15._0_4_ + auVar19._0_4_;
  auVar251._4_4_ = auVar15._4_4_ + auVar19._4_4_;
  auVar251._8_4_ = auVar15._8_4_ + auVar19._8_4_;
  auVar251._12_4_ = auVar15._12_4_ + auVar19._12_4_;
  auVar19 = vfmadd231ps_fma(auVar160,auVar15,auVar52 << 0x20);
  auVar16 = vpermilps_avx(auVar81,0xc9);
  auVar15 = vdpps_avx(auVar16,auVar16,0x7f);
  auVar20 = vfmadd231ps_fma(auVar251,auVar14,auVar202);
  auVar21 = vfmadd231ps_fma(auVar19,auVar14,auVar202);
  auVar19 = vpermilps_avx(auVar79,0xc9);
  fVar177 = auVar15._0_4_;
  auVar181 = ZEXT416((uint)fVar177);
  auVar14 = vrsqrtss_avx(auVar181,auVar181);
  fVar77 = auVar14._0_4_;
  auVar14 = vdpps_avx(auVar16,auVar19,0x7f);
  fVar77 = fVar77 * 1.5 + fVar177 * -0.5 * fVar77 * fVar77 * fVar77;
  auVar103._0_4_ = fVar177 * auVar19._0_4_;
  auVar103._4_4_ = fVar177 * auVar19._4_4_;
  auVar103._8_4_ = fVar177 * auVar19._8_4_;
  auVar103._12_4_ = fVar177 * auVar19._12_4_;
  fVar177 = auVar14._0_4_;
  auVar204._0_4_ = fVar177 * auVar16._0_4_;
  auVar204._4_4_ = fVar177 * auVar16._4_4_;
  auVar204._8_4_ = fVar177 * auVar16._8_4_;
  auVar204._12_4_ = fVar177 * auVar16._12_4_;
  auVar19 = vsubps_avx(auVar103,auVar204);
  auVar14 = vrcpss_avx(auVar181,auVar181);
  auVar15 = vfnmadd213ss_fma(auVar15,auVar14,SUB6416(ZEXT464(0x40000000),0));
  fVar94 = auVar14._0_4_ * auVar15._0_4_;
  auVar181 = vpermilps_avx(auVar80,0xc9);
  fVar114 = auVar16._0_4_ * fVar77;
  fVar134 = auVar16._4_4_ * fVar77;
  fVar135 = auVar16._8_4_ * fVar77;
  fVar136 = auVar16._12_4_ * fVar77;
  auVar15 = vdpps_avx(auVar181,auVar181,0x7f);
  auVar14 = vblendps_avx(auVar15,_DAT_01feba10,0xe);
  auVar16 = vrsqrtss_avx(auVar14,auVar14);
  fVar196 = auVar15._0_4_;
  fVar177 = auVar16._0_4_;
  fVar177 = fVar177 * 1.5 + fVar177 * fVar177 * fVar196 * -0.5 * fVar177;
  auVar16 = vpermilps_avx(auVar95,0xc9);
  auVar270._0_4_ = fVar196 * auVar16._0_4_;
  auVar270._4_4_ = fVar196 * auVar16._4_4_;
  auVar270._8_4_ = fVar196 * auVar16._8_4_;
  auVar270._12_4_ = fVar196 * auVar16._12_4_;
  auVar16 = vdpps_avx(auVar181,auVar16,0x7f);
  fVar196 = auVar16._0_4_;
  auVar231._0_4_ = fVar196 * auVar181._0_4_;
  auVar231._4_4_ = fVar196 * auVar181._4_4_;
  auVar231._8_4_ = fVar196 * auVar181._8_4_;
  auVar231._12_4_ = fVar196 * auVar181._12_4_;
  auVar16 = vsubps_avx(auVar270,auVar231);
  auVar14 = vrcpss_avx(auVar14,auVar14);
  auVar15 = vfnmadd213ss_fma(auVar15,auVar14,SUB6416(ZEXT464(0x40000000),0));
  fVar196 = auVar14._0_4_ * auVar15._0_4_;
  fVar137 = auVar181._0_4_ * fVar177;
  fVar155 = auVar181._4_4_ * fVar177;
  fVar156 = auVar181._8_4_ * fVar177;
  fVar157 = auVar181._12_4_ * fVar177;
  auVar14 = vshufps_avx(auVar116,auVar116,0xff);
  auVar15 = vshufps_avx(auVar20,auVar20,0xff);
  auVar232._0_4_ = auVar15._0_4_ * fVar114;
  auVar232._4_4_ = auVar15._4_4_ * fVar134;
  auVar232._8_4_ = auVar15._8_4_ * fVar135;
  auVar232._12_4_ = auVar15._12_4_ * fVar136;
  auVar87._0_4_ = auVar14._0_4_ * fVar114 + auVar15._0_4_ * fVar77 * fVar94 * auVar19._0_4_;
  auVar87._4_4_ = auVar14._4_4_ * fVar134 + auVar15._4_4_ * fVar77 * fVar94 * auVar19._4_4_;
  auVar87._8_4_ = auVar14._8_4_ * fVar135 + auVar15._8_4_ * fVar77 * fVar94 * auVar19._8_4_;
  auVar87._12_4_ = auVar14._12_4_ * fVar136 + auVar15._12_4_ * fVar77 * fVar94 * auVar19._12_4_;
  auVar19 = vsubps_avx(auVar20,auVar232);
  local_598._0_4_ = auVar20._0_4_ + auVar232._0_4_;
  local_598._4_4_ = auVar20._4_4_ + auVar232._4_4_;
  fStack_590 = auVar20._8_4_ + auVar232._8_4_;
  fStack_58c = auVar20._12_4_ + auVar232._12_4_;
  auVar181 = vsubps_avx(auVar116,auVar87);
  auVar14 = vshufps_avx(auVar91,auVar91,0xff);
  auVar15 = vshufps_avx(auVar21,auVar21,0xff);
  auVar142._0_4_ = auVar15._0_4_ * fVar137;
  auVar142._4_4_ = auVar15._4_4_ * fVar155;
  auVar142._8_4_ = auVar15._8_4_ * fVar156;
  auVar142._12_4_ = auVar15._12_4_ * fVar157;
  auVar182._0_4_ = auVar14._0_4_ * fVar137 + auVar15._0_4_ * fVar177 * auVar16._0_4_ * fVar196;
  auVar182._4_4_ = auVar14._4_4_ * fVar155 + auVar15._4_4_ * fVar177 * auVar16._4_4_ * fVar196;
  auVar182._8_4_ = auVar14._8_4_ * fVar156 + auVar15._8_4_ * fVar177 * auVar16._8_4_ * fVar196;
  auVar182._12_4_ = auVar14._12_4_ * fVar157 + auVar15._12_4_ * fVar177 * auVar16._12_4_ * fVar196;
  auVar16 = vsubps_avx(auVar21,auVar142);
  local_608._4_4_ = auVar21._4_4_ + auVar142._4_4_;
  local_608._0_4_ = auVar21._0_4_ + auVar142._0_4_;
  fStack_600 = auVar21._8_4_ + auVar142._8_4_;
  fStack_5fc = auVar21._12_4_ + auVar142._12_4_;
  auVar20 = vsubps_avx(auVar91,auVar182);
  auVar183._8_4_ = 0x80000000;
  auVar183._0_8_ = 0x8000000080000000;
  auVar183._12_4_ = 0x80000000;
  local_4a8 = auVar62._0_4_;
  fStack_4a4 = auVar62._4_4_;
  fStack_4a0 = auVar62._8_4_;
  auVar143._0_4_ = local_4a8 * -0.0;
  auVar143._4_4_ = fStack_4a4 * -0.0;
  auVar143._8_4_ = fStack_4a0 * -0.0;
  auVar143._12_4_ = fVar138 * -0.0;
  auVar14 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar18,auVar143);
  auVar233._0_4_ = auVar18._0_4_ + auVar143._0_4_;
  auVar233._4_4_ = auVar18._4_4_ + auVar143._4_4_;
  auVar233._8_4_ = auVar18._8_4_ + auVar143._8_4_;
  auVar233._12_4_ = auVar18._12_4_ + auVar143._12_4_;
  auVar337._0_4_ = auVar17._0_4_ + auVar14._0_4_;
  auVar337._4_4_ = auVar17._4_4_ + auVar14._4_4_;
  auVar337._8_4_ = auVar17._8_4_ + auVar14._8_4_;
  auVar337._12_4_ = auVar17._12_4_ + auVar14._12_4_;
  auVar14 = vfmadd231ps_fma(auVar233,auVar17,ZEXT416(0) << 0x20);
  auVar21 = vfmadd231ps_fma(auVar337,auVar184,auVar183);
  auVar140 = vfmadd231ps_fma(auVar14,auVar184,auVar183);
  auVar18 = vpermilps_avx(auVar96,0xc9);
  auVar14 = vdpps_avx(auVar18,auVar18,0x7f);
  fVar177 = auVar14._0_4_;
  auVar184 = ZEXT416((uint)fVar177);
  auVar15 = vrsqrtss_avx(auVar184,auVar184);
  fVar77 = auVar15._0_4_;
  auVar17 = vpermilps_avx(auVar97,0xc9);
  auVar15 = vdpps_avx(auVar18,auVar17,0x7f);
  fVar77 = fVar177 * -0.5 * fVar77 * fVar77 * fVar77 + fVar77 * 1.5;
  auVar252._0_4_ = fVar177 * auVar17._0_4_;
  auVar252._4_4_ = fVar177 * auVar17._4_4_;
  auVar252._8_4_ = fVar177 * auVar17._8_4_;
  auVar252._12_4_ = fVar177 * auVar17._12_4_;
  fVar177 = auVar15._0_4_;
  auVar271._0_4_ = fVar177 * auVar18._0_4_;
  auVar271._4_4_ = fVar177 * auVar18._4_4_;
  auVar271._8_4_ = fVar177 * auVar18._8_4_;
  auVar271._12_4_ = fVar177 * auVar18._12_4_;
  auVar17 = vsubps_avx(auVar252,auVar271);
  auVar15 = vrcpss_avx(auVar184,auVar184);
  auVar14 = vfnmadd213ss_fma(auVar14,auVar15,SUB6416(ZEXT464(0x40000000),0));
  fVar94 = auVar15._0_4_ * auVar14._0_4_;
  auVar184 = vpermilps_avx(auVar115,0xc9);
  auVar14 = vdpps_avx(auVar184,auVar184,0x7f);
  fVar138 = auVar18._0_4_ * fVar77;
  fVar114 = auVar18._4_4_ * fVar77;
  fVar134 = auVar18._8_4_ * fVar77;
  fVar135 = auVar18._12_4_ * fVar77;
  fVar196 = auVar14._0_4_;
  auVar91 = ZEXT416((uint)fVar196);
  auVar15 = vrsqrtss_avx(auVar91,auVar91);
  fVar177 = auVar15._0_4_;
  fVar177 = fVar177 * 1.5 + fVar196 * -0.5 * fVar177 * fVar177 * fVar177;
  auVar18 = vpermilps_avx(auVar257,0xc9);
  auVar15 = vdpps_avx(auVar184,auVar18,0x7f);
  auVar282._0_4_ = fVar196 * auVar18._0_4_;
  auVar282._4_4_ = fVar196 * auVar18._4_4_;
  auVar282._8_4_ = fVar196 * auVar18._8_4_;
  auVar282._12_4_ = fVar196 * auVar18._12_4_;
  fVar196 = auVar15._0_4_;
  auVar307._0_4_ = fVar196 * auVar184._0_4_;
  auVar307._4_4_ = fVar196 * auVar184._4_4_;
  auVar307._8_4_ = fVar196 * auVar184._8_4_;
  auVar307._12_4_ = fVar196 * auVar184._12_4_;
  auVar18 = vsubps_avx(auVar282,auVar307);
  auVar15 = vrcpss_avx(auVar91,auVar91);
  auVar14 = vfnmadd213ss_fma(auVar14,auVar15,SUB6416(ZEXT464(0x40000000),0));
  fVar196 = auVar14._0_4_ * auVar15._0_4_;
  fVar136 = fVar177 * auVar184._0_4_;
  fVar137 = fVar177 * auVar184._4_4_;
  fVar155 = fVar177 * auVar184._8_4_;
  fVar156 = fVar177 * auVar184._12_4_;
  auVar14 = vshufps_avx(auVar117,auVar117,0xff);
  auVar15 = vshufps_avx(auVar21,auVar21,0xff);
  auVar144._0_4_ = auVar15._0_4_ * fVar138;
  auVar144._4_4_ = auVar15._4_4_ * fVar114;
  auVar144._8_4_ = auVar15._8_4_ * fVar134;
  auVar144._12_4_ = auVar15._12_4_ * fVar135;
  auVar161._0_4_ = auVar14._0_4_ * fVar138 + auVar15._0_4_ * fVar77 * auVar17._0_4_ * fVar94;
  auVar161._4_4_ = auVar14._4_4_ * fVar114 + auVar15._4_4_ * fVar77 * auVar17._4_4_ * fVar94;
  auVar161._8_4_ = auVar14._8_4_ * fVar134 + auVar15._8_4_ * fVar77 * auVar17._8_4_ * fVar94;
  auVar161._12_4_ = auVar14._12_4_ * fVar135 + auVar15._12_4_ * fVar77 * auVar17._12_4_ * fVar94;
  auVar17 = vsubps_avx(auVar21,auVar144);
  fVar94 = auVar21._0_4_ + auVar144._0_4_;
  fVar138 = auVar21._4_4_ + auVar144._4_4_;
  fVar114 = auVar21._8_4_ + auVar144._8_4_;
  fVar134 = auVar21._12_4_ + auVar144._12_4_;
  auVar184 = vsubps_avx(auVar117,auVar161);
  auVar14 = vshufps_avx(auVar118,auVar118,0xff);
  auVar15 = vshufps_avx(auVar140,auVar140,0xff);
  auVar272._0_4_ = auVar15._0_4_ * fVar136;
  auVar272._4_4_ = auVar15._4_4_ * fVar137;
  auVar272._8_4_ = auVar15._8_4_ * fVar155;
  auVar272._12_4_ = auVar15._12_4_ * fVar156;
  auVar205._0_4_ = fVar136 * auVar14._0_4_ + auVar15._0_4_ * fVar177 * auVar18._0_4_ * fVar196;
  auVar205._4_4_ = fVar137 * auVar14._4_4_ + auVar15._4_4_ * fVar177 * auVar18._4_4_ * fVar196;
  auVar205._8_4_ = fVar155 * auVar14._8_4_ + auVar15._8_4_ * fVar177 * auVar18._8_4_ * fVar196;
  auVar205._12_4_ = fVar156 * auVar14._12_4_ + auVar15._12_4_ * fVar177 * auVar18._12_4_ * fVar196;
  auVar14 = vsubps_avx(auVar140,auVar272);
  auVar162._0_4_ = auVar272._0_4_ + auVar140._0_4_;
  auVar162._4_4_ = auVar272._4_4_ + auVar140._4_4_;
  auVar162._8_4_ = auVar272._8_4_ + auVar140._8_4_;
  auVar162._12_4_ = auVar272._12_4_ + auVar140._12_4_;
  auVar15 = vsubps_avx(auVar118,auVar205);
  local_648._0_4_ = auVar181._0_4_;
  local_648._4_4_ = auVar181._4_4_;
  uStack_640._0_4_ = auVar181._8_4_;
  uStack_640._4_4_ = auVar181._12_4_;
  auVar320._0_4_ = auVar19._0_4_ + (float)local_648._0_4_ * 0.33333334;
  auVar320._4_4_ = auVar19._4_4_ + (float)local_648._4_4_ * 0.33333334;
  auVar320._8_4_ = auVar19._8_4_ + (float)uStack_640 * 0.33333334;
  auVar320._12_4_ = auVar19._12_4_ + uStack_640._4_4_ * 0.33333334;
  fVar77 = 1.0 - fVar195;
  auVar206._4_4_ = fVar77;
  auVar206._0_4_ = fVar77;
  auVar206._8_4_ = fVar77;
  auVar206._12_4_ = fVar77;
  auVar283._0_4_ = fVar195 * auVar17._0_4_;
  auVar283._4_4_ = fVar195 * auVar17._4_4_;
  auVar283._8_4_ = fVar195 * auVar17._8_4_;
  auVar283._12_4_ = fVar195 * auVar17._12_4_;
  local_428 = vfmadd231ps_fma(auVar283,auVar206,auVar19);
  auVar119._0_4_ = fVar195 * (auVar17._0_4_ + auVar184._0_4_ * 0.33333334);
  auVar119._4_4_ = fVar195 * (auVar17._4_4_ + auVar184._4_4_ * 0.33333334);
  auVar119._8_4_ = fVar195 * (auVar17._8_4_ + auVar184._8_4_ * 0.33333334);
  auVar119._12_4_ = fVar195 * (auVar17._12_4_ + auVar184._12_4_ * 0.33333334);
  auVar19 = vfmadd231ps_fma(auVar119,auVar206,auVar320);
  local_628 = auVar20._0_4_;
  fStack_624 = auVar20._4_4_;
  fStack_620 = auVar20._8_4_;
  fStack_61c = auVar20._12_4_;
  auVar120._0_4_ = local_628 * 0.33333334;
  auVar120._4_4_ = fStack_624 * 0.33333334;
  auVar120._8_4_ = fStack_620 * 0.33333334;
  auVar120._12_4_ = fStack_61c * 0.33333334;
  auVar17 = vsubps_avx(auVar16,auVar120);
  auVar321._0_4_ = (fVar280 + auVar87._0_4_) * 0.33333334 + (float)local_598._0_4_;
  auVar321._4_4_ = (fVar197 + auVar87._4_4_) * 0.33333334 + (float)local_598._4_4_;
  auVar321._8_4_ = (fVar291 + auVar87._8_4_) * 0.33333334 + fStack_590;
  auVar321._12_4_ = (fVar222 + auVar87._12_4_) * 0.33333334 + fStack_58c;
  auVar308._0_4_ = (fVar294 + auVar182._0_4_) * 0.33333334;
  auVar308._4_4_ = (fVar225 + auVar182._4_4_) * 0.33333334;
  auVar308._8_4_ = (fVar295 + auVar182._8_4_) * 0.33333334;
  auVar308._12_4_ = (fVar226 + auVar182._12_4_) * 0.33333334;
  auVar18 = vsubps_avx(_local_608,auVar308);
  auVar298._0_4_ = auVar15._0_4_ * 0.33333334;
  auVar298._4_4_ = auVar15._4_4_ * 0.33333334;
  auVar298._8_4_ = auVar15._8_4_ * 0.33333334;
  auVar298._12_4_ = auVar15._12_4_ * 0.33333334;
  auVar15 = vsubps_avx(auVar14,auVar298);
  auVar234._0_4_ = (fVar296 + auVar205._0_4_) * 0.33333334;
  auVar234._4_4_ = (fVar227 + auVar205._4_4_) * 0.33333334;
  auVar234._8_4_ = (fVar228 + auVar205._8_4_) * 0.33333334;
  auVar234._12_4_ = (fVar245 + auVar205._12_4_) * 0.33333334;
  auVar184 = vsubps_avx(auVar162,auVar234);
  auVar299._0_4_ = fVar195 * auVar15._0_4_;
  auVar299._4_4_ = fVar195 * auVar15._4_4_;
  auVar299._8_4_ = fVar195 * auVar15._8_4_;
  auVar299._12_4_ = fVar195 * auVar15._12_4_;
  auVar253._0_4_ = fVar195 * auVar14._0_4_;
  auVar253._4_4_ = fVar195 * auVar14._4_4_;
  auVar253._8_4_ = fVar195 * auVar14._8_4_;
  auVar253._12_4_ = fVar195 * auVar14._12_4_;
  local_438 = vfmadd231ps_fma(auVar299,auVar206,auVar17);
  auVar181 = vfmadd231ps_fma(auVar253,auVar206,auVar16);
  auVar104._0_4_ = fVar195 * fVar94;
  auVar104._4_4_ = fVar195 * fVar138;
  auVar104._8_4_ = fVar195 * fVar114;
  auVar104._12_4_ = fVar195 * fVar134;
  auVar121._0_4_ = fVar195 * (fVar94 + (fVar292 + auVar161._0_4_) * 0.33333334);
  auVar121._4_4_ = fVar195 * (fVar138 + (fVar223 + auVar161._4_4_) * 0.33333334);
  auVar121._8_4_ = fVar195 * (fVar114 + (fVar293 + auVar161._8_4_) * 0.33333334);
  auVar121._12_4_ = fVar195 * (fVar134 + (fVar224 + auVar161._12_4_) * 0.33333334);
  auVar185._0_4_ = fVar195 * auVar184._0_4_;
  auVar185._4_4_ = fVar195 * auVar184._4_4_;
  auVar185._8_4_ = fVar195 * auVar184._8_4_;
  auVar185._12_4_ = fVar195 * auVar184._12_4_;
  auVar163._0_4_ = fVar195 * auVar162._0_4_;
  auVar163._4_4_ = fVar195 * auVar162._4_4_;
  auVar163._8_4_ = fVar195 * auVar162._8_4_;
  auVar163._12_4_ = fVar195 * auVar162._12_4_;
  _local_448 = vfmadd231ps_fma(auVar104,auVar206,_local_598);
  _local_458 = vfmadd231ps_fma(auVar121,auVar206,auVar321);
  auVar20 = vfmadd231ps_fma(auVar185,auVar206,auVar18);
  auVar14 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar14 = vinsertps_avx(auVar14,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  auVar21 = vfmadd231ps_fma(auVar163,auVar206,_local_608);
  local_408 = vsubps_avx(local_428,auVar14);
  auVar15 = vshufps_avx(local_408,local_408,0x55);
  auVar16 = vshufps_avx(local_408,local_408,0xaa);
  aVar5 = pre->ray_space[k].vy.field_0;
  fVar77 = pre->ray_space[k].vz.field_0.m128[0];
  fVar177 = pre->ray_space[k].vz.field_0.m128[1];
  fVar195 = pre->ray_space[k].vz.field_0.m128[2];
  fVar94 = pre->ray_space[k].vz.field_0.m128[3];
  auVar88._0_4_ = fVar77 * auVar16._0_4_;
  auVar88._4_4_ = fVar177 * auVar16._4_4_;
  auVar88._8_4_ = fVar195 * auVar16._8_4_;
  auVar88._12_4_ = fVar94 * auVar16._12_4_;
  auVar17 = vfmadd231ps_fma(auVar88,(undefined1  [16])aVar5,auVar15);
  local_418 = vsubps_avx(auVar19,auVar14);
  auVar15 = vshufps_avx(local_418,local_418,0x55);
  auVar16 = vshufps_avx(local_418,local_418,0xaa);
  auVar345._0_4_ = fVar77 * auVar16._0_4_;
  auVar345._4_4_ = fVar177 * auVar16._4_4_;
  auVar345._8_4_ = fVar195 * auVar16._8_4_;
  auVar345._12_4_ = fVar94 * auVar16._12_4_;
  auVar16 = vfmadd231ps_fma(auVar345,(undefined1  [16])aVar5,auVar15);
  local_298 = vsubps_avx(local_438,auVar14);
  auVar15 = vshufps_avx(local_298,local_298,0xaa);
  auVar338._0_4_ = fVar77 * auVar15._0_4_;
  auVar338._4_4_ = fVar177 * auVar15._4_4_;
  auVar338._8_4_ = fVar195 * auVar15._8_4_;
  auVar338._12_4_ = fVar94 * auVar15._12_4_;
  auVar15 = vshufps_avx(local_298,local_298,0x55);
  auVar18 = vfmadd231ps_fma(auVar338,(undefined1  [16])aVar5,auVar15);
  local_2a8 = vsubps_avx(auVar181,auVar14);
  auVar15 = vshufps_avx(local_2a8,local_2a8,0xaa);
  auVar322._0_4_ = fVar77 * auVar15._0_4_;
  auVar322._4_4_ = fVar177 * auVar15._4_4_;
  auVar322._8_4_ = fVar195 * auVar15._8_4_;
  auVar322._12_4_ = fVar94 * auVar15._12_4_;
  auVar15 = vshufps_avx(local_2a8,local_2a8,0x55);
  auVar184 = vfmadd231ps_fma(auVar322,(undefined1  [16])aVar5,auVar15);
  local_2b8 = vsubps_avx(_local_448,auVar14);
  auVar15 = vshufps_avx(local_2b8,local_2b8,0xaa);
  auVar164._0_4_ = fVar77 * auVar15._0_4_;
  auVar164._4_4_ = fVar177 * auVar15._4_4_;
  auVar164._8_4_ = fVar195 * auVar15._8_4_;
  auVar164._12_4_ = fVar94 * auVar15._12_4_;
  auVar15 = vshufps_avx(local_2b8,local_2b8,0x55);
  auVar118 = vfmadd231ps_fma(auVar164,(undefined1  [16])aVar5,auVar15);
  local_2c8 = vsubps_avx(_local_458,auVar14);
  auVar15 = vshufps_avx(local_2c8,local_2c8,0xaa);
  auVar235._0_4_ = fVar77 * auVar15._0_4_;
  auVar235._4_4_ = fVar177 * auVar15._4_4_;
  auVar235._8_4_ = fVar195 * auVar15._8_4_;
  auVar235._12_4_ = fVar94 * auVar15._12_4_;
  auVar15 = vshufps_avx(local_2c8,local_2c8,0x55);
  auVar140 = vfmadd231ps_fma(auVar235,(undefined1  [16])aVar5,auVar15);
  local_2d8 = vsubps_avx(auVar20,auVar14);
  auVar15 = vshufps_avx(local_2d8,local_2d8,0xaa);
  auVar273._0_4_ = fVar77 * auVar15._0_4_;
  auVar273._4_4_ = fVar177 * auVar15._4_4_;
  auVar273._8_4_ = fVar195 * auVar15._8_4_;
  auVar273._12_4_ = fVar94 * auVar15._12_4_;
  auVar15 = vshufps_avx(local_2d8,local_2d8,0x55);
  auVar15 = vfmadd231ps_fma(auVar273,(undefined1  [16])aVar5,auVar15);
  local_2e8 = vsubps_avx(auVar21,auVar14);
  auVar14 = vshufps_avx(local_2e8,local_2e8,0xaa);
  auVar186._0_4_ = fVar77 * auVar14._0_4_;
  auVar186._4_4_ = fVar177 * auVar14._4_4_;
  auVar186._8_4_ = fVar195 * auVar14._8_4_;
  auVar186._12_4_ = fVar94 * auVar14._12_4_;
  auVar14 = vshufps_avx(local_2e8,local_2e8,0x55);
  auVar14 = vfmadd231ps_fma(auVar186,(undefined1  [16])aVar5,auVar14);
  auVar207._4_4_ = local_408._0_4_;
  auVar207._0_4_ = local_408._0_4_;
  auVar207._8_4_ = local_408._0_4_;
  auVar207._12_4_ = local_408._0_4_;
  aVar5 = pre->ray_space[k].vx.field_0;
  auVar91 = vfmadd231ps_fma(auVar17,(undefined1  [16])aVar5,auVar207);
  auVar208._4_4_ = local_418._0_4_;
  auVar208._0_4_ = local_418._0_4_;
  auVar208._8_4_ = local_418._0_4_;
  auVar208._12_4_ = local_418._0_4_;
  auVar81 = vfmadd231ps_fma(auVar16,(undefined1  [16])aVar5,auVar208);
  uVar78 = local_298._0_4_;
  auVar209._4_4_ = uVar78;
  auVar209._0_4_ = uVar78;
  auVar209._8_4_ = uVar78;
  auVar209._12_4_ = uVar78;
  auVar79 = vfmadd231ps_fma(auVar18,(undefined1  [16])aVar5,auVar209);
  uVar78 = local_2a8._0_4_;
  auVar210._4_4_ = uVar78;
  auVar210._0_4_ = uVar78;
  auVar210._8_4_ = uVar78;
  auVar210._12_4_ = uVar78;
  auVar80 = vfmadd231ps_fma(auVar184,(undefined1  [16])aVar5,auVar210);
  uVar78 = local_2b8._0_4_;
  auVar211._4_4_ = uVar78;
  auVar211._0_4_ = uVar78;
  auVar211._8_4_ = uVar78;
  auVar211._12_4_ = uVar78;
  auVar118 = vfmadd231ps_fma(auVar118,(undefined1  [16])aVar5,auVar211);
  uVar78 = local_2c8._0_4_;
  auVar212._4_4_ = uVar78;
  auVar212._0_4_ = uVar78;
  auVar212._8_4_ = uVar78;
  auVar212._12_4_ = uVar78;
  auVar140 = vfmadd231ps_fma(auVar140,(undefined1  [16])aVar5,auVar212);
  uVar78 = local_2d8._0_4_;
  auVar213._4_4_ = uVar78;
  auVar213._0_4_ = uVar78;
  auVar213._8_4_ = uVar78;
  auVar213._12_4_ = uVar78;
  auVar95 = vfmadd231ps_fma(auVar15,(undefined1  [16])aVar5,auVar213);
  uVar78 = local_2e8._0_4_;
  auVar214._4_4_ = uVar78;
  auVar214._0_4_ = uVar78;
  auVar214._8_4_ = uVar78;
  auVar214._12_4_ = uVar78;
  auVar96 = vfmadd231ps_fma(auVar14,(undefined1  [16])aVar5,auVar214);
  auVar17 = vmovlhps_avx(auVar91,auVar118);
  auVar18 = vmovlhps_avx(auVar81,auVar140);
  auVar184 = vmovlhps_avx(auVar79,auVar95);
  _local_3f8 = vmovlhps_avx(auVar80,auVar96);
  auVar14 = vminps_avx(auVar17,auVar18);
  auVar15 = vminps_avx(auVar184,_local_3f8);
  auVar16 = vminps_avx(auVar14,auVar15);
  auVar14 = vmaxps_avx(auVar17,auVar18);
  auVar15 = vmaxps_avx(auVar184,_local_3f8);
  auVar14 = vmaxps_avx(auVar14,auVar15);
  auVar15 = vshufpd_avx(auVar16,auVar16,3);
  auVar16 = vminps_avx(auVar16,auVar15);
  auVar15 = vshufpd_avx(auVar14,auVar14,3);
  auVar15 = vmaxps_avx(auVar14,auVar15);
  auVar14 = vandps_avx(auVar16,auVar335);
  auVar15 = vandps_avx(auVar15,auVar335);
  auVar14 = vmaxps_avx(auVar14,auVar15);
  auVar15 = vmovshdup_avx(auVar14);
  auVar14 = vmaxss_avx(auVar15,auVar14);
  local_178 = auVar14._0_4_ * 9.536743e-07;
  auVar215._8_8_ = auVar91._0_8_;
  auVar215._0_8_ = auVar91._0_8_;
  auVar254._8_8_ = auVar81._0_8_;
  auVar254._0_8_ = auVar81._0_8_;
  auVar284._8_8_ = auVar79._0_8_;
  auVar284._0_8_ = auVar79._0_8_;
  auVar323._0_8_ = auVar80._0_8_;
  auVar323._8_8_ = auVar323._0_8_;
  local_288 = ZEXT416((uint)local_178);
  fStack_174 = local_178;
  fStack_170 = local_178;
  fStack_16c = local_178;
  fStack_168 = local_178;
  fStack_164 = local_178;
  fStack_160 = local_178;
  fStack_15c = local_178;
  fStack_190 = -local_178;
  local_198 = -local_178;
  fStack_194 = -local_178;
  fStack_18c = fStack_190;
  fStack_188 = fStack_190;
  fStack_184 = fStack_190;
  fStack_180 = fStack_190;
  fStack_17c = fStack_190;
  local_318 = uVar67;
  uStack_314 = uVar67;
  uStack_310 = uVar67;
  uStack_30c = uVar67;
  uStack_324 = local_328;
  uStack_320 = local_328;
  uStack_31c = local_328;
  uVar74 = 0;
  uVar68 = 0;
  fVar77 = *(float *)(ray + k * 4 + 0x30);
  auVar14 = vsubps_avx(auVar18,auVar17);
  auVar15 = vsubps_avx(auVar184,auVar18);
  local_278 = vsubps_avx(_local_3f8,auVar184);
  local_338 = vsubps_avx(_local_448,local_428);
  local_348 = vsubps_avx(_local_458,auVar19);
  local_358 = vsubps_avx(auVar20,local_438);
  _local_368 = vsubps_avx(auVar21,auVar181);
  local_658 = ZEXT816(0x3f80000000000000);
  local_2f8 = local_658;
  do {
    auVar16 = vshufps_avx(local_658,local_658,0x50);
    auVar145._8_4_ = 0x3f800000;
    auVar145._0_8_ = &DAT_3f8000003f800000;
    auVar145._12_4_ = 0x3f800000;
    auVar152._16_4_ = 0x3f800000;
    auVar152._0_16_ = auVar145;
    auVar152._20_4_ = 0x3f800000;
    auVar152._24_4_ = 0x3f800000;
    auVar152._28_4_ = 0x3f800000;
    auVar91 = vsubps_avx(auVar145,auVar16);
    fVar177 = auVar16._0_4_;
    fVar136 = auVar118._0_4_;
    auVar89._0_4_ = fVar136 * fVar177;
    fVar195 = auVar16._4_4_;
    fVar137 = auVar118._4_4_;
    auVar89._4_4_ = fVar137 * fVar195;
    fVar94 = auVar16._8_4_;
    auVar89._8_4_ = fVar136 * fVar94;
    fVar196 = auVar16._12_4_;
    auVar89._12_4_ = fVar137 * fVar196;
    fVar228 = auVar140._0_4_;
    auVar187._0_4_ = fVar228 * fVar177;
    fVar245 = auVar140._4_4_;
    auVar187._4_4_ = fVar245 * fVar195;
    auVar187._8_4_ = fVar228 * fVar94;
    auVar187._12_4_ = fVar245 * fVar196;
    fVar268 = auVar95._0_4_;
    auVar236._0_4_ = fVar268 * fVar177;
    fVar279 = auVar95._4_4_;
    auVar236._4_4_ = fVar279 * fVar195;
    auVar236._8_4_ = fVar268 * fVar94;
    auVar236._12_4_ = fVar279 * fVar196;
    fVar332 = auVar96._0_4_;
    auVar309._0_4_ = fVar332 * fVar177;
    fVar343 = auVar96._4_4_;
    auVar309._4_4_ = fVar343 * fVar195;
    auVar309._8_4_ = fVar332 * fVar94;
    auVar309._12_4_ = fVar343 * fVar196;
    auVar80 = vfmadd231ps_fma(auVar89,auVar91,auVar215);
    auVar97 = vfmadd231ps_fma(auVar187,auVar91,auVar254);
    auVar115 = vfmadd231ps_fma(auVar236,auVar91,auVar284);
    auVar257 = vfmadd231ps_fma(auVar309,auVar323,auVar91);
    local_5b8 = auVar257._0_4_;
    auVar16 = vmovshdup_avx(local_2f8);
    fVar177 = local_2f8._0_4_;
    fVar138 = (auVar16._0_4_ - fVar177) * 0.04761905;
    auVar267._4_4_ = fVar177;
    auVar267._0_4_ = fVar177;
    auVar267._8_4_ = fVar177;
    auVar267._12_4_ = fVar177;
    auVar267._16_4_ = fVar177;
    auVar267._20_4_ = fVar177;
    auVar267._24_4_ = fVar177;
    auVar267._28_4_ = fVar177;
    auVar131._0_8_ = auVar16._0_8_;
    auVar131._8_8_ = auVar131._0_8_;
    auVar131._16_8_ = auVar131._0_8_;
    auVar131._24_8_ = auVar131._0_8_;
    auVar93 = vsubps_avx(auVar131,auVar267);
    uVar78 = auVar80._0_4_;
    auVar349._4_4_ = uVar78;
    auVar349._0_4_ = uVar78;
    auVar349._8_4_ = uVar78;
    auVar349._12_4_ = uVar78;
    auVar349._16_4_ = uVar78;
    auVar349._20_4_ = uVar78;
    auVar349._24_4_ = uVar78;
    auVar349._28_4_ = uVar78;
    auVar16 = vmovshdup_avx(auVar80);
    uVar198 = auVar16._0_8_;
    auVar330._8_8_ = uVar198;
    auVar330._0_8_ = uVar198;
    auVar330._16_8_ = uVar198;
    auVar330._24_8_ = uVar198;
    fVar114 = auVar97._0_4_;
    auVar112._4_4_ = fVar114;
    auVar112._0_4_ = fVar114;
    auVar112._8_4_ = fVar114;
    auVar112._12_4_ = fVar114;
    auVar112._16_4_ = fVar114;
    auVar112._20_4_ = fVar114;
    auVar112._24_4_ = fVar114;
    auVar112._28_4_ = fVar114;
    auVar91 = vmovshdup_avx(auVar97);
    auVar219._0_8_ = auVar91._0_8_;
    auVar219._8_8_ = auVar219._0_8_;
    auVar219._16_8_ = auVar219._0_8_;
    auVar219._24_8_ = auVar219._0_8_;
    fVar155 = auVar115._0_4_;
    auVar306._4_4_ = fVar155;
    auVar306._0_4_ = fVar155;
    auVar306._8_4_ = fVar155;
    auVar306._12_4_ = fVar155;
    auVar306._16_4_ = fVar155;
    auVar306._20_4_ = fVar155;
    auVar306._24_4_ = fVar155;
    auVar306._28_4_ = fVar155;
    auVar81 = vmovshdup_avx(auVar115);
    auVar278._0_8_ = auVar81._0_8_;
    auVar278._8_8_ = auVar278._0_8_;
    auVar278._16_8_ = auVar278._0_8_;
    auVar278._24_8_ = auVar278._0_8_;
    auVar79 = vmovshdup_avx(auVar257);
    auVar116 = vfmadd132ps_fma(auVar93,auVar267,_DAT_02020f20);
    auVar93 = vsubps_avx(auVar152,ZEXT1632(auVar116));
    fVar177 = auVar116._0_4_;
    auVar340._0_4_ = fVar114 * fVar177;
    fVar195 = auVar116._4_4_;
    auVar340._4_4_ = fVar114 * fVar195;
    fVar94 = auVar116._8_4_;
    auVar340._8_4_ = fVar114 * fVar94;
    fVar196 = auVar116._12_4_;
    auVar340._12_4_ = fVar114 * fVar196;
    auVar340._16_4_ = fVar114 * 0.0;
    auVar340._20_4_ = fVar114 * 0.0;
    auVar340._24_4_ = fVar114 * 0.0;
    auVar340._28_4_ = 0;
    auVar116 = vfmadd231ps_fma(auVar340,auVar93,auVar349);
    fVar134 = auVar91._0_4_;
    auVar316._0_4_ = fVar134 * fVar177;
    fVar135 = auVar91._4_4_;
    auVar316._4_4_ = fVar135 * fVar195;
    auVar316._8_4_ = fVar134 * fVar94;
    auVar316._12_4_ = fVar135 * fVar196;
    auVar316._16_4_ = fVar134 * 0.0;
    auVar316._20_4_ = fVar135 * 0.0;
    auVar316._24_4_ = fVar134 * 0.0;
    auVar316._28_4_ = 0;
    auVar117 = vfmadd231ps_fma(auVar316,auVar93,auVar330);
    auVar22._4_4_ = fVar155 * fVar195;
    auVar22._0_4_ = fVar155 * fVar177;
    auVar22._8_4_ = fVar155 * fVar94;
    auVar22._12_4_ = fVar155 * fVar196;
    auVar22._16_4_ = fVar155 * 0.0;
    auVar22._20_4_ = fVar155 * 0.0;
    auVar22._24_4_ = fVar155 * 0.0;
    auVar22._28_4_ = auVar16._4_4_;
    auVar158 = vfmadd231ps_fma(auVar22,auVar93,auVar112);
    fVar134 = auVar81._0_4_;
    fVar135 = auVar81._4_4_;
    auVar23._4_4_ = fVar135 * fVar195;
    auVar23._0_4_ = fVar134 * fVar177;
    auVar23._8_4_ = fVar134 * fVar94;
    auVar23._12_4_ = fVar135 * fVar196;
    auVar23._16_4_ = fVar134 * 0.0;
    auVar23._20_4_ = fVar135 * 0.0;
    auVar23._24_4_ = fVar134 * 0.0;
    auVar23._28_4_ = uVar78;
    auVar167 = vfmadd231ps_fma(auVar23,auVar93,auVar219);
    auVar16 = vshufps_avx(auVar80,auVar80,0xaa);
    auVar220._0_8_ = auVar16._0_8_;
    auVar220._8_8_ = auVar220._0_8_;
    auVar220._16_8_ = auVar220._0_8_;
    auVar220._24_8_ = auVar220._0_8_;
    auVar91 = vshufps_avx(auVar80,auVar80,0xff);
    uStack_640 = auVar91._0_8_;
    local_648 = (undefined1  [8])uStack_640;
    uStack_638 = uStack_640;
    uStack_630 = uStack_640;
    auVar24._4_4_ = fVar195 * local_5b8;
    auVar24._0_4_ = fVar177 * local_5b8;
    auVar24._8_4_ = fVar94 * local_5b8;
    auVar24._12_4_ = fVar196 * local_5b8;
    auVar24._16_4_ = local_5b8 * 0.0;
    auVar24._20_4_ = local_5b8 * 0.0;
    auVar24._24_4_ = local_5b8 * 0.0;
    auVar24._28_4_ = 0x3f800000;
    auVar199 = vfmadd231ps_fma(auVar24,auVar93,auVar306);
    auVar81 = vshufps_avx(auVar97,auVar97,0xaa);
    auVar175._0_8_ = auVar81._0_8_;
    auVar175._8_8_ = auVar175._0_8_;
    auVar175._16_8_ = auVar175._0_8_;
    auVar175._24_8_ = auVar175._0_8_;
    auVar80 = vshufps_avx(auVar97,auVar97,0xff);
    auVar194._0_8_ = auVar80._0_8_;
    auVar194._8_8_ = auVar194._0_8_;
    auVar194._16_8_ = auVar194._0_8_;
    auVar194._24_8_ = auVar194._0_8_;
    fVar134 = auVar79._0_4_;
    fVar135 = auVar79._4_4_;
    auVar25._4_4_ = fVar135 * fVar195;
    auVar25._0_4_ = fVar134 * fVar177;
    auVar25._8_4_ = fVar134 * fVar94;
    auVar25._12_4_ = fVar135 * fVar196;
    auVar25._16_4_ = fVar134 * 0.0;
    auVar25._20_4_ = fVar135 * 0.0;
    auVar25._24_4_ = fVar134 * 0.0;
    auVar25._28_4_ = fVar155;
    auVar200 = vfmadd231ps_fma(auVar25,auVar93,auVar278);
    auVar26._28_4_ = fVar114;
    auVar26._0_28_ =
         ZEXT1628(CONCAT412(auVar158._12_4_ * fVar196,
                            CONCAT48(auVar158._8_4_ * fVar94,
                                     CONCAT44(auVar158._4_4_ * fVar195,auVar158._0_4_ * fVar177))));
    auVar116 = vfmadd231ps_fma(auVar26,auVar93,ZEXT1632(auVar116));
    auVar27._28_4_ = auVar91._4_4_;
    auVar27._0_28_ =
         ZEXT1628(CONCAT412(auVar167._12_4_ * fVar196,
                            CONCAT48(auVar167._8_4_ * fVar94,
                                     CONCAT44(auVar167._4_4_ * fVar195,auVar167._0_4_ * fVar177))));
    auVar117 = vfmadd231ps_fma(auVar27,auVar93,ZEXT1632(auVar117));
    auVar91 = vshufps_avx(auVar115,auVar115,0xaa);
    uVar198 = auVar91._0_8_;
    auVar317._8_8_ = uVar198;
    auVar317._0_8_ = uVar198;
    auVar317._16_8_ = uVar198;
    auVar317._24_8_ = uVar198;
    auVar79 = vshufps_avx(auVar115,auVar115,0xff);
    uVar198 = auVar79._0_8_;
    auVar341._8_8_ = uVar198;
    auVar341._0_8_ = uVar198;
    auVar341._16_8_ = uVar198;
    auVar341._24_8_ = uVar198;
    auVar158 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar196 * auVar199._12_4_,
                                                  CONCAT48(fVar94 * auVar199._8_4_,
                                                           CONCAT44(fVar195 * auVar199._4_4_,
                                                                    fVar177 * auVar199._0_4_)))),
                               auVar93,ZEXT1632(auVar158));
    auVar97 = vshufps_avx(auVar257,auVar257,0xaa);
    auVar115 = vshufps_avx(auVar257,auVar257,0xff);
    local_5b8 = auVar115._0_4_;
    fStack_5b4 = auVar115._4_4_;
    auVar28._28_4_ = fStack_5b4;
    auVar28._0_28_ =
         ZEXT1628(CONCAT412(auVar200._12_4_ * fVar196,
                            CONCAT48(auVar200._8_4_ * fVar94,
                                     CONCAT44(auVar200._4_4_ * fVar195,auVar200._0_4_ * fVar177))));
    auVar115 = vfmadd231ps_fma(auVar28,auVar93,ZEXT1632(auVar167));
    auVar257 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar196 * auVar158._12_4_,
                                                  CONCAT48(fVar94 * auVar158._8_4_,
                                                           CONCAT44(fVar195 * auVar158._4_4_,
                                                                    fVar177 * auVar158._0_4_)))),
                               auVar93,ZEXT1632(auVar116));
    auVar22 = vsubps_avx(ZEXT1632(auVar158),ZEXT1632(auVar116));
    auVar116 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar196 * auVar115._12_4_,
                                                  CONCAT48(fVar94 * auVar115._8_4_,
                                                           CONCAT44(fVar195 * auVar115._4_4_,
                                                                    fVar177 * auVar115._0_4_)))),
                               auVar93,ZEXT1632(auVar117));
    auVar23 = vsubps_avx(ZEXT1632(auVar115),ZEXT1632(auVar117));
    fVar280 = fVar138 * auVar22._0_4_ * 3.0;
    fVar291 = fVar138 * auVar22._4_4_ * 3.0;
    auVar318._4_4_ = fVar291;
    auVar318._0_4_ = fVar280;
    fVar292 = fVar138 * auVar22._8_4_ * 3.0;
    auVar318._8_4_ = fVar292;
    fVar293 = fVar138 * auVar22._12_4_ * 3.0;
    auVar318._12_4_ = fVar293;
    fVar294 = fVar138 * auVar22._16_4_ * 3.0;
    auVar318._16_4_ = fVar294;
    fVar295 = fVar138 * auVar22._20_4_ * 3.0;
    auVar318._20_4_ = fVar295;
    fVar296 = fVar138 * auVar22._24_4_ * 3.0;
    auVar318._24_4_ = fVar296;
    auVar318._28_4_ = 0x40400000;
    local_5d8._0_4_ = fVar138 * auVar23._0_4_ * 3.0;
    local_5d8._4_4_ = fVar138 * auVar23._4_4_ * 3.0;
    fStack_5d0 = fVar138 * auVar23._8_4_ * 3.0;
    fStack_5cc = fVar138 * auVar23._12_4_ * 3.0;
    fStack_5c8 = fVar138 * auVar23._16_4_ * 3.0;
    fStack_5c4 = fVar138 * auVar23._20_4_ * 3.0;
    fStack_5c0 = fVar138 * auVar23._24_4_ * 3.0;
    fStack_5bc = auVar23._28_4_;
    fVar114 = auVar81._0_4_;
    fVar134 = auVar81._4_4_;
    auVar29._4_4_ = fVar134 * fVar195;
    auVar29._0_4_ = fVar114 * fVar177;
    auVar29._8_4_ = fVar114 * fVar94;
    auVar29._12_4_ = fVar134 * fVar196;
    auVar29._16_4_ = fVar114 * 0.0;
    auVar29._20_4_ = fVar134 * 0.0;
    auVar29._24_4_ = fVar114 * 0.0;
    auVar29._28_4_ = auVar22._28_4_;
    auVar81 = vfmadd231ps_fma(auVar29,auVar93,auVar220);
    fVar114 = auVar80._0_4_;
    fVar135 = auVar80._4_4_;
    auVar30._4_4_ = fVar135 * fVar195;
    auVar30._0_4_ = fVar114 * fVar177;
    auVar30._8_4_ = fVar114 * fVar94;
    auVar30._12_4_ = fVar135 * fVar196;
    auVar30._16_4_ = fVar114 * 0.0;
    auVar30._20_4_ = fVar135 * 0.0;
    auVar30._24_4_ = fVar114 * 0.0;
    auVar30._28_4_ = auVar16._4_4_;
    auVar16 = vfmadd231ps_fma(auVar30,auVar93,_local_648);
    fVar114 = auVar91._0_4_;
    fVar135 = auVar91._4_4_;
    auVar31._4_4_ = fVar135 * fVar195;
    auVar31._0_4_ = fVar114 * fVar177;
    auVar31._8_4_ = fVar114 * fVar94;
    auVar31._12_4_ = fVar135 * fVar196;
    auVar31._16_4_ = fVar114 * 0.0;
    auVar31._20_4_ = fVar135 * 0.0;
    auVar31._24_4_ = fVar114 * 0.0;
    auVar31._28_4_ = fVar138;
    auVar91 = vfmadd231ps_fma(auVar31,auVar93,auVar175);
    fVar114 = auVar79._0_4_;
    fVar155 = auVar79._4_4_;
    auVar32._4_4_ = fVar155 * fVar195;
    auVar32._0_4_ = fVar114 * fVar177;
    auVar32._8_4_ = fVar114 * fVar94;
    auVar32._12_4_ = fVar155 * fVar196;
    auVar32._16_4_ = fVar114 * 0.0;
    auVar32._20_4_ = fVar155 * 0.0;
    auVar32._24_4_ = fVar114 * 0.0;
    auVar32._28_4_ = fVar134;
    auVar79 = vfmadd231ps_fma(auVar32,auVar93,auVar194);
    local_3e8 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar257));
    fVar114 = auVar97._0_4_;
    fVar134 = auVar97._4_4_;
    auVar33._4_4_ = fVar134 * fVar195;
    auVar33._0_4_ = fVar114 * fVar177;
    auVar33._8_4_ = fVar114 * fVar94;
    auVar33._12_4_ = fVar134 * fVar196;
    auVar33._16_4_ = fVar114 * 0.0;
    auVar33._20_4_ = fVar134 * 0.0;
    auVar33._24_4_ = fVar114 * 0.0;
    auVar33._28_4_ = local_3e8._28_4_;
    auVar80 = vfmadd231ps_fma(auVar33,auVar93,auVar317);
    auVar26 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar116));
    auVar34._4_4_ = fVar195 * fStack_5b4;
    auVar34._0_4_ = fVar177 * local_5b8;
    auVar34._8_4_ = fVar94 * local_5b8;
    auVar34._12_4_ = fVar196 * fStack_5b4;
    auVar34._16_4_ = local_5b8 * 0.0;
    auVar34._20_4_ = fStack_5b4 * 0.0;
    auVar34._24_4_ = local_5b8 * 0.0;
    auVar34._28_4_ = fVar135;
    auVar97 = vfmadd231ps_fma(auVar34,auVar93,auVar341);
    auVar35._28_4_ = fVar134;
    auVar35._0_28_ =
         ZEXT1628(CONCAT412(fVar196 * auVar91._12_4_,
                            CONCAT48(fVar94 * auVar91._8_4_,
                                     CONCAT44(fVar195 * auVar91._4_4_,fVar177 * auVar91._0_4_))));
    auVar81 = vfmadd231ps_fma(auVar35,auVar93,ZEXT1632(auVar81));
    auVar16 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar196 * auVar79._12_4_,
                                                 CONCAT48(fVar94 * auVar79._8_4_,
                                                          CONCAT44(fVar195 * auVar79._4_4_,
                                                                   fVar177 * auVar79._0_4_)))),
                              auVar93,ZEXT1632(auVar16));
    fVar280 = auVar257._0_4_ + fVar280;
    fVar291 = auVar257._4_4_ + fVar291;
    fVar292 = auVar257._8_4_ + fVar292;
    fVar293 = auVar257._12_4_ + fVar293;
    fVar294 = fVar294 + 0.0;
    fVar295 = fVar295 + 0.0;
    fVar296 = fVar296 + 0.0;
    auVar36._28_4_ = 0x40400000;
    auVar36._0_28_ =
         ZEXT1628(CONCAT412(auVar97._12_4_ * fVar196,
                            CONCAT48(auVar97._8_4_ * fVar94,
                                     CONCAT44(auVar97._4_4_ * fVar195,auVar97._0_4_ * fVar177))));
    auVar91 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar196 * auVar80._12_4_,
                                                 CONCAT48(fVar94 * auVar80._8_4_,
                                                          CONCAT44(fVar195 * auVar80._4_4_,
                                                                   fVar177 * auVar80._0_4_)))),
                              auVar93,ZEXT1632(auVar91));
    auVar79 = vfmadd231ps_fma(auVar36,auVar93,ZEXT1632(auVar79));
    auVar80 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar196 * auVar91._12_4_,
                                                 CONCAT48(fVar94 * auVar91._8_4_,
                                                          CONCAT44(fVar195 * auVar91._4_4_,
                                                                   fVar177 * auVar91._0_4_)))),
                              auVar93,ZEXT1632(auVar81));
    auVar97 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar196 * auVar79._12_4_,
                                                 CONCAT48(fVar94 * auVar79._8_4_,
                                                          CONCAT44(fVar195 * auVar79._4_4_,
                                                                   fVar177 * auVar79._0_4_)))),
                              ZEXT1632(auVar16),auVar93);
    auVar93 = vsubps_avx(ZEXT1632(auVar91),ZEXT1632(auVar81));
    auVar22 = vsubps_avx(ZEXT1632(auVar79),ZEXT1632(auVar16));
    fVar177 = fVar138 * auVar93._0_4_ * 3.0;
    fVar195 = fVar138 * auVar93._4_4_ * 3.0;
    auVar37._4_4_ = fVar195;
    auVar37._0_4_ = fVar177;
    fVar94 = fVar138 * auVar93._8_4_ * 3.0;
    auVar37._8_4_ = fVar94;
    fVar196 = fVar138 * auVar93._12_4_ * 3.0;
    auVar37._12_4_ = fVar196;
    fVar155 = fVar138 * auVar93._16_4_ * 3.0;
    auVar37._16_4_ = fVar155;
    fVar156 = fVar138 * auVar93._20_4_ * 3.0;
    auVar37._20_4_ = fVar156;
    fVar157 = fVar138 * auVar93._24_4_ * 3.0;
    auVar37._24_4_ = fVar157;
    auVar37._28_4_ = 0x40400000;
    auVar244._0_4_ = fVar138 * auVar22._0_4_ * 3.0;
    auVar244._4_4_ = fVar138 * auVar22._4_4_ * 3.0;
    auVar244._8_4_ = fVar138 * auVar22._8_4_ * 3.0;
    auVar244._12_4_ = fVar138 * auVar22._12_4_ * 3.0;
    auVar244._16_4_ = fVar138 * auVar22._16_4_ * 3.0;
    auVar244._20_4_ = fVar138 * auVar22._20_4_ * 3.0;
    auVar244._24_4_ = fVar138 * auVar22._24_4_ * 3.0;
    auVar244._28_4_ = 0;
    auVar27 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar80));
    local_388 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar97));
    auVar93 = vsubps_avx(ZEXT1632(auVar80),ZEXT1632(auVar257));
    auVar22 = vsubps_avx(ZEXT1632(auVar97),ZEXT1632(auVar116));
    auVar24 = vsubps_avx(auVar27,local_3e8);
    fVar197 = auVar93._0_4_ + auVar24._0_4_;
    fVar222 = auVar93._4_4_ + auVar24._4_4_;
    fVar223 = auVar93._8_4_ + auVar24._8_4_;
    fVar224 = auVar93._12_4_ + auVar24._12_4_;
    fVar225 = auVar93._16_4_ + auVar24._16_4_;
    fVar226 = auVar93._20_4_ + auVar24._20_4_;
    fVar227 = auVar93._24_4_ + auVar24._24_4_;
    auVar25 = vsubps_avx(local_388,auVar26);
    auVar331._0_4_ = auVar22._0_4_ + auVar25._0_4_;
    auVar331._4_4_ = auVar22._4_4_ + auVar25._4_4_;
    auVar331._8_4_ = auVar22._8_4_ + auVar25._8_4_;
    auVar331._12_4_ = auVar22._12_4_ + auVar25._12_4_;
    auVar331._16_4_ = auVar22._16_4_ + auVar25._16_4_;
    auVar331._20_4_ = auVar22._20_4_ + auVar25._20_4_;
    auVar331._24_4_ = auVar22._24_4_ + auVar25._24_4_;
    auVar331._28_4_ = auVar22._28_4_ + auVar25._28_4_;
    fVar138 = auVar116._0_4_;
    local_138 = fVar138 + (float)local_5d8._0_4_;
    fVar114 = auVar116._4_4_;
    fStack_134 = fVar114 + (float)local_5d8._4_4_;
    fVar134 = auVar116._8_4_;
    fStack_130 = fVar134 + fStack_5d0;
    fVar135 = auVar116._12_4_;
    fStack_12c = fVar135 + fStack_5cc;
    fStack_128 = fStack_5c8 + 0.0;
    fStack_124 = fStack_5c4 + 0.0;
    fStack_120 = fStack_5c0 + 0.0;
    fStack_11c = auVar23._28_4_ + 0.0;
    local_78 = ZEXT1632(auVar257);
    auVar22 = vsubps_avx(local_78,auVar318);
    local_b8 = vpermps_avx2(_DAT_0205d4a0,auVar22);
    local_98 = ZEXT1632(auVar116);
    auVar22 = vsubps_avx(local_98,_local_5d8);
    local_158 = vpermps_avx2(_DAT_0205d4a0,auVar22);
    local_d8._0_4_ = auVar80._0_4_ + fVar177;
    local_d8._4_4_ = auVar80._4_4_ + fVar195;
    local_d8._8_4_ = auVar80._8_4_ + fVar94;
    local_d8._12_4_ = auVar80._12_4_ + fVar196;
    local_d8._16_4_ = fVar155 + 0.0;
    local_d8._20_4_ = fVar156 + 0.0;
    local_d8._24_4_ = fVar157 + 0.0;
    local_d8._28_4_ = 0x40400000;
    auVar318 = ZEXT1632(auVar80);
    auVar22 = vsubps_avx(auVar318,auVar37);
    auVar28 = vpermps_avx2(_DAT_0205d4a0,auVar22);
    fVar177 = auVar97._0_4_;
    local_118._0_4_ = fVar177 + auVar244._0_4_;
    fVar195 = auVar97._4_4_;
    local_118._4_4_ = fVar195 + auVar244._4_4_;
    fVar94 = auVar97._8_4_;
    local_118._8_4_ = fVar94 + auVar244._8_4_;
    fVar196 = auVar97._12_4_;
    local_118._12_4_ = fVar196 + auVar244._12_4_;
    local_118._16_4_ = auVar244._16_4_ + 0.0;
    local_118._20_4_ = auVar244._20_4_ + 0.0;
    local_118._24_4_ = auVar244._24_4_ + 0.0;
    local_118._28_4_ = 0;
    auVar22 = vsubps_avx(ZEXT1632(auVar97),auVar244);
    local_f8 = vpermps_avx2(_DAT_0205d4a0,auVar22);
    auVar38._4_4_ = fVar114 * fVar222;
    auVar38._0_4_ = fVar138 * fVar197;
    auVar38._8_4_ = fVar134 * fVar223;
    auVar38._12_4_ = fVar135 * fVar224;
    auVar38._16_4_ = fVar225 * 0.0;
    auVar38._20_4_ = fVar226 * 0.0;
    auVar38._24_4_ = fVar227 * 0.0;
    auVar38._28_4_ = auVar22._28_4_;
    auVar16 = vfnmadd231ps_fma(auVar38,local_78,auVar331);
    auVar39._4_4_ = fStack_134 * fVar222;
    auVar39._0_4_ = local_138 * fVar197;
    auVar39._8_4_ = fStack_130 * fVar223;
    auVar39._12_4_ = fStack_12c * fVar224;
    auVar39._16_4_ = fStack_128 * fVar225;
    auVar39._20_4_ = fStack_124 * fVar226;
    auVar39._24_4_ = fStack_120 * fVar227;
    auVar39._28_4_ = auVar28._28_4_;
    auVar54._4_4_ = fVar291;
    auVar54._0_4_ = fVar280;
    auVar54._8_4_ = fVar292;
    auVar54._12_4_ = fVar293;
    auVar54._16_4_ = fVar294;
    auVar54._20_4_ = fVar295;
    auVar54._24_4_ = fVar296;
    auVar54._28_4_ = 0x40400000;
    auVar91 = vfnmadd231ps_fma(auVar39,auVar331,auVar54);
    auVar40._4_4_ = local_158._4_4_ * fVar222;
    auVar40._0_4_ = local_158._0_4_ * fVar197;
    auVar40._8_4_ = local_158._8_4_ * fVar223;
    auVar40._12_4_ = local_158._12_4_ * fVar224;
    auVar40._16_4_ = local_158._16_4_ * fVar225;
    auVar40._20_4_ = local_158._20_4_ * fVar226;
    auVar40._24_4_ = local_158._24_4_ * fVar227;
    auVar40._28_4_ = fStack_11c;
    auVar81 = vfnmadd231ps_fma(auVar40,local_b8,auVar331);
    local_648._0_4_ = auVar26._0_4_;
    local_648._4_4_ = auVar26._4_4_;
    uStack_640._0_4_ = auVar26._8_4_;
    uStack_640._4_4_ = auVar26._12_4_;
    uStack_638._0_4_ = auVar26._16_4_;
    uStack_638._4_4_ = auVar26._20_4_;
    uStack_630._0_4_ = auVar26._24_4_;
    auVar41._4_4_ = fVar222 * (float)local_648._4_4_;
    auVar41._0_4_ = fVar197 * (float)local_648._0_4_;
    auVar41._8_4_ = fVar223 * (float)uStack_640;
    auVar41._12_4_ = fVar224 * uStack_640._4_4_;
    auVar41._16_4_ = fVar225 * (float)uStack_638;
    auVar41._20_4_ = fVar226 * uStack_638._4_4_;
    auVar41._24_4_ = fVar227 * (float)uStack_630;
    auVar41._28_4_ = local_158._28_4_;
    auVar79 = vfnmadd231ps_fma(auVar41,local_3e8,auVar331);
    auVar60._4_4_ = fVar195 * fVar222;
    auVar60._0_4_ = fVar177 * fVar197;
    auVar60._8_4_ = fVar94 * fVar223;
    auVar60._12_4_ = fVar196 * fVar224;
    auVar60._16_4_ = fVar225 * 0.0;
    auVar60._20_4_ = fVar226 * 0.0;
    auVar60._24_4_ = fVar227 * 0.0;
    auVar60._28_4_ = DAT_0205d4a0._28_4_;
    auVar80 = vfnmadd231ps_fma(auVar60,auVar318,auVar331);
    auVar42._4_4_ = local_118._4_4_ * fVar222;
    auVar42._0_4_ = local_118._0_4_ * fVar197;
    auVar42._8_4_ = local_118._8_4_ * fVar223;
    auVar42._12_4_ = local_118._12_4_ * fVar224;
    auVar42._16_4_ = local_118._16_4_ * fVar225;
    auVar42._20_4_ = local_118._20_4_ * fVar226;
    auVar42._24_4_ = local_118._24_4_ * fVar227;
    auVar42._28_4_ = local_3e8._28_4_;
    auVar115 = vfnmadd231ps_fma(auVar42,local_d8,auVar331);
    auVar43._4_4_ = local_f8._4_4_ * fVar222;
    auVar43._0_4_ = local_f8._0_4_ * fVar197;
    auVar43._8_4_ = local_f8._8_4_ * fVar223;
    auVar43._12_4_ = local_f8._12_4_ * fVar224;
    auVar43._16_4_ = local_f8._16_4_ * fVar225;
    auVar43._20_4_ = local_f8._20_4_ * fVar226;
    auVar43._24_4_ = local_f8._24_4_ * fVar227;
    auVar43._28_4_ = local_b8._28_4_;
    auVar257 = vfnmadd231ps_fma(auVar43,auVar331,auVar28);
    auVar44._4_4_ = local_388._4_4_ * fVar222;
    auVar44._0_4_ = local_388._0_4_ * fVar197;
    auVar44._8_4_ = local_388._8_4_ * fVar223;
    auVar44._12_4_ = local_388._12_4_ * fVar224;
    auVar44._16_4_ = local_388._16_4_ * fVar225;
    auVar44._20_4_ = local_388._20_4_ * fVar226;
    auVar44._24_4_ = local_388._24_4_ * fVar227;
    auVar44._28_4_ = auVar93._28_4_ + auVar24._28_4_;
    auVar116 = vfnmadd231ps_fma(auVar44,auVar331,auVar27);
    auVar22 = vminps_avx(ZEXT1632(auVar16),ZEXT1632(auVar91));
    auVar93 = vmaxps_avx(ZEXT1632(auVar16),ZEXT1632(auVar91));
    auVar23 = vminps_avx(ZEXT1632(auVar81),ZEXT1632(auVar79));
    auVar23 = vminps_avx(auVar22,auVar23);
    auVar22 = vmaxps_avx(ZEXT1632(auVar81),ZEXT1632(auVar79));
    auVar93 = vmaxps_avx(auVar93,auVar22);
    auVar24 = vminps_avx(ZEXT1632(auVar80),ZEXT1632(auVar115));
    auVar22 = vmaxps_avx(ZEXT1632(auVar80),ZEXT1632(auVar115));
    auVar25 = vminps_avx(ZEXT1632(auVar257),ZEXT1632(auVar116));
    auVar24 = vminps_avx(auVar24,auVar25);
    auVar24 = vminps_avx(auVar23,auVar24);
    auVar23 = vmaxps_avx(ZEXT1632(auVar257),ZEXT1632(auVar116));
    auVar22 = vmaxps_avx(auVar22,auVar23);
    auVar22 = vmaxps_avx(auVar93,auVar22);
    auVar59._4_4_ = fStack_174;
    auVar59._0_4_ = local_178;
    auVar59._8_4_ = fStack_170;
    auVar59._12_4_ = fStack_16c;
    auVar59._16_4_ = fStack_168;
    auVar59._20_4_ = fStack_164;
    auVar59._24_4_ = fStack_160;
    auVar59._28_4_ = fStack_15c;
    auVar93 = vcmpps_avx(auVar24,auVar59,2);
    auVar58._4_4_ = fStack_194;
    auVar58._0_4_ = local_198;
    auVar58._8_4_ = fStack_190;
    auVar58._12_4_ = fStack_18c;
    auVar58._16_4_ = fStack_188;
    auVar58._20_4_ = fStack_184;
    auVar58._24_4_ = fStack_180;
    auVar58._28_4_ = fStack_17c;
    auVar22 = vcmpps_avx(auVar22,auVar58,5);
    auVar93 = vandps_avx(auVar22,auVar93);
    auVar22 = local_268 & auVar93;
    uVar64 = 0;
    if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar22 >> 0x7f,0) != '\0') ||
          (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar22 >> 0xbf,0) != '\0') ||
        (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar22[0x1f] < '\0')
    {
      auVar22 = vsubps_avx(local_3e8,local_78);
      auVar23 = vsubps_avx(auVar27,auVar318);
      fVar156 = auVar22._0_4_ + auVar23._0_4_;
      fVar157 = auVar22._4_4_ + auVar23._4_4_;
      fVar197 = auVar22._8_4_ + auVar23._8_4_;
      fVar222 = auVar22._12_4_ + auVar23._12_4_;
      fVar223 = auVar22._16_4_ + auVar23._16_4_;
      fVar224 = auVar22._20_4_ + auVar23._20_4_;
      fVar225 = auVar22._24_4_ + auVar23._24_4_;
      auVar24 = vsubps_avx(auVar26,local_98);
      auVar25 = vsubps_avx(local_388,ZEXT1632(auVar97));
      auVar113._0_4_ = auVar24._0_4_ + auVar25._0_4_;
      auVar113._4_4_ = auVar24._4_4_ + auVar25._4_4_;
      auVar113._8_4_ = auVar24._8_4_ + auVar25._8_4_;
      auVar113._12_4_ = auVar24._12_4_ + auVar25._12_4_;
      auVar113._16_4_ = auVar24._16_4_ + auVar25._16_4_;
      auVar113._20_4_ = auVar24._20_4_ + auVar25._20_4_;
      auVar113._24_4_ = auVar24._24_4_ + auVar25._24_4_;
      fVar155 = auVar25._28_4_;
      auVar113._28_4_ = auVar24._28_4_ + fVar155;
      auVar342._0_4_ = fVar138 * fVar156;
      auVar342._4_4_ = fVar114 * fVar157;
      auVar342._8_4_ = fVar134 * fVar197;
      auVar342._12_4_ = fVar135 * fVar222;
      auVar342._16_4_ = fVar223 * 0.0;
      auVar342._20_4_ = fVar224 * 0.0;
      auVar342._24_4_ = fVar225 * 0.0;
      auVar342._28_4_ = 0;
      auVar80 = vfnmadd231ps_fma(auVar342,auVar113,local_78);
      auVar45._4_4_ = fVar157 * fStack_134;
      auVar45._0_4_ = fVar156 * local_138;
      auVar45._8_4_ = fVar197 * fStack_130;
      auVar45._12_4_ = fVar222 * fStack_12c;
      auVar45._16_4_ = fVar223 * fStack_128;
      auVar45._20_4_ = fVar224 * fStack_124;
      auVar45._24_4_ = fVar225 * fStack_120;
      auVar45._28_4_ = fVar155;
      auVar55._4_4_ = fVar291;
      auVar55._0_4_ = fVar280;
      auVar55._8_4_ = fVar292;
      auVar55._12_4_ = fVar293;
      auVar55._16_4_ = fVar294;
      auVar55._20_4_ = fVar295;
      auVar55._24_4_ = fVar296;
      auVar55._28_4_ = 0x40400000;
      auVar16 = vfnmadd213ps_fma(auVar55,auVar113,auVar45);
      auVar46._4_4_ = fVar157 * local_158._4_4_;
      auVar46._0_4_ = fVar156 * local_158._0_4_;
      auVar46._8_4_ = fVar197 * local_158._8_4_;
      auVar46._12_4_ = fVar222 * local_158._12_4_;
      auVar46._16_4_ = fVar223 * local_158._16_4_;
      auVar46._20_4_ = fVar224 * local_158._20_4_;
      auVar46._24_4_ = fVar225 * local_158._24_4_;
      auVar46._28_4_ = fVar155;
      auVar91 = vfnmadd213ps_fma(local_b8,auVar113,auVar46);
      auVar47._4_4_ = (float)local_648._4_4_ * fVar157;
      auVar47._0_4_ = (float)local_648._0_4_ * fVar156;
      auVar47._8_4_ = (float)uStack_640 * fVar197;
      auVar47._12_4_ = uStack_640._4_4_ * fVar222;
      auVar47._16_4_ = (float)uStack_638 * fVar223;
      auVar47._20_4_ = uStack_638._4_4_ * fVar224;
      auVar47._24_4_ = (float)uStack_630 * fVar225;
      auVar47._28_4_ = fVar155;
      auVar97 = vfnmadd231ps_fma(auVar47,auVar113,local_3e8);
      auVar132._0_4_ = fVar177 * fVar156;
      auVar132._4_4_ = fVar195 * fVar157;
      auVar132._8_4_ = fVar94 * fVar197;
      auVar132._12_4_ = fVar196 * fVar222;
      auVar132._16_4_ = fVar223 * 0.0;
      auVar132._20_4_ = fVar224 * 0.0;
      auVar132._24_4_ = fVar225 * 0.0;
      auVar132._28_4_ = 0;
      auVar115 = vfnmadd231ps_fma(auVar132,auVar113,auVar318);
      auVar48._4_4_ = fVar157 * local_118._4_4_;
      auVar48._0_4_ = fVar156 * local_118._0_4_;
      auVar48._8_4_ = fVar197 * local_118._8_4_;
      auVar48._12_4_ = fVar222 * local_118._12_4_;
      auVar48._16_4_ = fVar223 * local_118._16_4_;
      auVar48._20_4_ = fVar224 * local_118._20_4_;
      auVar48._24_4_ = fVar225 * local_118._24_4_;
      auVar48._28_4_ = auVar26._28_4_;
      auVar81 = vfnmadd213ps_fma(local_d8,auVar113,auVar48);
      auVar49._4_4_ = fVar157 * local_f8._4_4_;
      auVar49._0_4_ = fVar156 * local_f8._0_4_;
      auVar49._8_4_ = fVar197 * local_f8._8_4_;
      auVar49._12_4_ = fVar222 * local_f8._12_4_;
      auVar49._16_4_ = fVar223 * local_f8._16_4_;
      auVar49._20_4_ = fVar224 * local_f8._20_4_;
      auVar49._24_4_ = fVar225 * local_f8._24_4_;
      auVar49._28_4_ = auVar26._28_4_;
      auVar79 = vfnmadd213ps_fma(auVar28,auVar113,auVar49);
      auVar50._4_4_ = local_388._4_4_ * fVar157;
      auVar50._0_4_ = local_388._0_4_ * fVar156;
      auVar50._8_4_ = local_388._8_4_ * fVar197;
      auVar50._12_4_ = local_388._12_4_ * fVar222;
      auVar50._16_4_ = local_388._16_4_ * fVar223;
      auVar50._20_4_ = local_388._20_4_ * fVar224;
      auVar50._24_4_ = local_388._24_4_ * fVar225;
      auVar50._28_4_ = auVar22._28_4_ + auVar23._28_4_;
      auVar257 = vfnmadd231ps_fma(auVar50,auVar113,auVar27);
      auVar23 = vminps_avx(ZEXT1632(auVar80),ZEXT1632(auVar16));
      auVar22 = vmaxps_avx(ZEXT1632(auVar80),ZEXT1632(auVar16));
      auVar24 = vminps_avx(ZEXT1632(auVar91),ZEXT1632(auVar97));
      auVar24 = vminps_avx(auVar23,auVar24);
      auVar23 = vmaxps_avx(ZEXT1632(auVar91),ZEXT1632(auVar97));
      auVar22 = vmaxps_avx(auVar22,auVar23);
      auVar25 = vminps_avx(ZEXT1632(auVar115),ZEXT1632(auVar81));
      auVar23 = vmaxps_avx(ZEXT1632(auVar115),ZEXT1632(auVar81));
      auVar26 = vminps_avx(ZEXT1632(auVar79),ZEXT1632(auVar257));
      auVar25 = vminps_avx(auVar25,auVar26);
      auVar25 = vminps_avx(auVar24,auVar25);
      auVar24 = vmaxps_avx(ZEXT1632(auVar79),ZEXT1632(auVar257));
      auVar23 = vmaxps_avx(auVar23,auVar24);
      auVar23 = vmaxps_avx(auVar22,auVar23);
      auVar22 = vcmpps_avx(auVar25,auVar59,2);
      auVar23 = vcmpps_avx(auVar23,auVar58,5);
      auVar22 = vandps_avx(auVar23,auVar22);
      auVar93 = vandps_avx(auVar93,local_268);
      auVar23 = auVar93 & auVar22;
      if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar23 >> 0x7f,0) != '\0') ||
            (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar23 >> 0xbf,0) != '\0') ||
          (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar23[0x1f] < '\0') {
        auVar93 = vandps_avx(auVar22,auVar93);
        uVar64 = vmovmskps_avx(auVar93);
      }
    }
    if (uVar64 != 0) {
      auStack_3c8[uVar68] = uVar64;
      uVar198 = vmovlps_avx(local_2f8);
      *(undefined8 *)(&uStack_248 + uVar68 * 2) = uVar198;
      uVar73 = vmovlps_avx(local_658);
      auStack_58[uVar68] = uVar73;
      uVar68 = (ulong)((int)uVar68 + 1);
    }
    do {
      if ((int)uVar68 == 0) {
        if ((uVar74 & 1) != 0) {
          return local_659;
        }
        uVar78 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar92._4_4_ = uVar78;
        auVar92._0_4_ = uVar78;
        auVar92._8_4_ = uVar78;
        auVar92._12_4_ = uVar78;
        auVar14 = vcmpps_avx(local_308,auVar92,2);
        uVar67 = vmovmskps_avx(auVar14);
        uVar63 = uVar63 & uVar63 + 0xf & uVar67;
        local_659 = uVar63 != 0;
        if (!local_659) {
          return local_659;
        }
        goto LAB_017ea434;
      }
      uVar65 = (int)uVar68 - 1;
      uVar69 = (ulong)uVar65;
      uVar72 = auStack_3c8[uVar69];
      uVar64 = (&uStack_248)[uVar69 * 2];
      fVar177 = afStack_244[uVar69 * 2];
      iVar66 = 0;
      for (uVar73 = (ulong)uVar72; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x8000000000000000) {
        iVar66 = iVar66 + 1;
      }
      uVar72 = uVar72 - 1 & uVar72;
      if (uVar72 == 0) {
        uVar68 = (ulong)uVar65;
      }
      local_658._8_8_ = 0;
      local_658._0_8_ = auStack_58[uVar69];
      auStack_3c8[uVar69] = uVar72;
      fVar195 = (float)(iVar66 + 1) * 0.14285715;
      auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar177 * (float)iVar66 * 0.14285715)),
                                ZEXT416(uVar64),ZEXT416((uint)(1.0 - (float)iVar66 * 0.14285715)));
      auVar91 = vfmadd231ss_fma(ZEXT416((uint)(fVar177 * fVar195)),ZEXT416(uVar64),
                                ZEXT416((uint)(1.0 - fVar195)));
      auVar221._0_4_ = auVar16._0_4_;
      fVar195 = auVar91._0_4_;
      fVar177 = fVar195 - auVar221._0_4_;
      if (0.16666667 <= fVar177) break;
      auVar81 = vshufps_avx(local_658,local_658,0x50);
      auVar122._8_4_ = 0x3f800000;
      auVar122._0_8_ = &DAT_3f8000003f800000;
      auVar122._12_4_ = 0x3f800000;
      auVar79 = vsubps_avx(auVar122,auVar81);
      fVar94 = auVar81._0_4_;
      auVar146._0_4_ = fVar94 * fVar136;
      fVar196 = auVar81._4_4_;
      auVar146._4_4_ = fVar196 * fVar137;
      fVar138 = auVar81._8_4_;
      auVar146._8_4_ = fVar138 * fVar136;
      fVar114 = auVar81._12_4_;
      auVar146._12_4_ = fVar114 * fVar137;
      auVar165._0_4_ = fVar94 * fVar228;
      auVar165._4_4_ = fVar196 * fVar245;
      auVar165._8_4_ = fVar138 * fVar228;
      auVar165._12_4_ = fVar114 * fVar245;
      auVar188._0_4_ = fVar94 * fVar268;
      auVar188._4_4_ = fVar196 * fVar279;
      auVar188._8_4_ = fVar138 * fVar268;
      auVar188._12_4_ = fVar114 * fVar279;
      auVar105._0_4_ = fVar94 * fVar332;
      auVar105._4_4_ = fVar196 * fVar343;
      auVar105._8_4_ = fVar138 * fVar332;
      auVar105._12_4_ = fVar114 * fVar343;
      auVar81 = vfmadd231ps_fma(auVar146,auVar79,auVar215);
      auVar80 = vfmadd231ps_fma(auVar165,auVar79,auVar254);
      auVar97 = vfmadd231ps_fma(auVar188,auVar79,auVar284);
      auVar79 = vfmadd231ps_fma(auVar105,auVar79,auVar323);
      auVar133._16_16_ = auVar81;
      auVar133._0_16_ = auVar81;
      auVar153._16_16_ = auVar80;
      auVar153._0_16_ = auVar80;
      auVar176._16_16_ = auVar97;
      auVar176._0_16_ = auVar97;
      auVar221._4_4_ = auVar221._0_4_;
      auVar221._8_4_ = auVar221._0_4_;
      auVar221._12_4_ = auVar221._0_4_;
      auVar221._20_4_ = fVar195;
      auVar221._16_4_ = fVar195;
      auVar221._24_4_ = fVar195;
      auVar221._28_4_ = fVar195;
      auVar93 = vsubps_avx(auVar153,auVar133);
      auVar80 = vfmadd213ps_fma(auVar93,auVar221,auVar133);
      auVar93 = vsubps_avx(auVar176,auVar153);
      auVar115 = vfmadd213ps_fma(auVar93,auVar221,auVar153);
      auVar81 = vsubps_avx(auVar79,auVar97);
      auVar154._16_16_ = auVar81;
      auVar154._0_16_ = auVar81;
      auVar81 = vfmadd213ps_fma(auVar154,auVar221,auVar176);
      auVar93 = vsubps_avx(ZEXT1632(auVar115),ZEXT1632(auVar80));
      auVar79 = vfmadd213ps_fma(auVar93,auVar221,ZEXT1632(auVar80));
      auVar93 = vsubps_avx(ZEXT1632(auVar81),ZEXT1632(auVar115));
      auVar81 = vfmadd213ps_fma(auVar93,auVar221,ZEXT1632(auVar115));
      auVar93 = vsubps_avx(ZEXT1632(auVar81),ZEXT1632(auVar79));
      auVar117 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar93,auVar221);
      fVar135 = auVar93._4_4_ * 3.0;
      fVar134 = fVar177 * 0.33333334;
      auVar285._0_8_ =
           CONCAT44(auVar117._4_4_ + fVar134 * fVar135,
                    auVar117._0_4_ + fVar134 * auVar93._0_4_ * 3.0);
      auVar285._8_4_ = auVar117._8_4_ + fVar134 * auVar93._8_4_ * 3.0;
      auVar285._12_4_ = auVar117._12_4_ + fVar134 * auVar93._12_4_ * 3.0;
      auVar79 = vshufpd_avx(auVar117,auVar117,3);
      auVar80 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar81 = vsubps_avx(auVar79,auVar117);
      auVar97 = vsubps_avx(auVar80,(undefined1  [16])0x0);
      auVar123._0_4_ = auVar81._0_4_ + auVar97._0_4_;
      auVar123._4_4_ = auVar81._4_4_ + auVar97._4_4_;
      auVar123._8_4_ = auVar81._8_4_ + auVar97._8_4_;
      auVar123._12_4_ = auVar81._12_4_ + auVar97._12_4_;
      auVar81 = vshufps_avx(auVar117,auVar117,0xb1);
      auVar97 = vshufps_avx(auVar285,auVar285,0xb1);
      auVar324._4_4_ = auVar123._0_4_;
      auVar324._0_4_ = auVar123._0_4_;
      auVar324._8_4_ = auVar123._0_4_;
      auVar324._12_4_ = auVar123._0_4_;
      auVar115 = vshufps_avx(auVar123,auVar123,0x55);
      fVar94 = auVar115._0_4_;
      auVar237._0_4_ = auVar81._0_4_ * fVar94;
      fVar196 = auVar115._4_4_;
      auVar237._4_4_ = auVar81._4_4_ * fVar196;
      fVar138 = auVar115._8_4_;
      auVar237._8_4_ = auVar81._8_4_ * fVar138;
      fVar114 = auVar115._12_4_;
      auVar237._12_4_ = auVar81._12_4_ * fVar114;
      auVar255._0_4_ = auVar97._0_4_ * fVar94;
      auVar255._4_4_ = auVar97._4_4_ * fVar196;
      auVar255._8_4_ = auVar97._8_4_ * fVar138;
      auVar255._12_4_ = auVar97._12_4_ * fVar114;
      auVar257 = vfmadd231ps_fma(auVar237,auVar324,auVar117);
      local_3e8._0_16_ = auVar285;
      auVar116 = vfmadd231ps_fma(auVar255,auVar324,auVar285);
      auVar97 = vshufps_avx(auVar257,auVar257,0xe8);
      auVar115 = vshufps_avx(auVar116,auVar116,0xe8);
      auVar81 = vcmpps_avx(auVar97,auVar115,1);
      uVar64 = vextractps_avx(auVar81,0);
      auVar158 = auVar116;
      if ((uVar64 & 1) == 0) {
        auVar158 = auVar257;
      }
      auVar166._0_4_ = fVar134 * auVar93._16_4_ * 3.0;
      auVar166._4_4_ = fVar134 * fVar135;
      auVar166._8_4_ = fVar134 * auVar93._24_4_ * 3.0;
      auVar166._12_4_ = fVar134 * fVar195;
      auVar201 = vsubps_avx((undefined1  [16])0x0,auVar166);
      auVar167 = vshufps_avx(auVar201,auVar201,0xb1);
      auVar199 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar346._0_4_ = auVar167._0_4_ * fVar94;
      auVar346._4_4_ = auVar167._4_4_ * fVar196;
      auVar346._8_4_ = auVar167._8_4_ * fVar138;
      auVar346._12_4_ = auVar167._12_4_ * fVar114;
      auVar124._0_4_ = auVar199._0_4_ * fVar94;
      auVar124._4_4_ = auVar199._4_4_ * fVar196;
      auVar124._8_4_ = auVar199._8_4_ * fVar138;
      auVar124._12_4_ = auVar199._12_4_ * fVar114;
      auVar229 = vfmadd231ps_fma(auVar346,auVar324,auVar201);
      auVar246 = vfmadd231ps_fma(auVar124,(undefined1  [16])0x0,auVar324);
      auVar199 = vshufps_avx(auVar229,auVar229,0xe8);
      auVar200 = vshufps_avx(auVar246,auVar246,0xe8);
      auVar167 = vcmpps_avx(auVar199,auVar200,1);
      uVar64 = vextractps_avx(auVar167,0);
      auVar247 = auVar246;
      if ((uVar64 & 1) == 0) {
        auVar247 = auVar229;
      }
      auVar158 = vmaxss_avx(auVar247,auVar158);
      auVar97 = vminps_avx(auVar97,auVar115);
      auVar115 = vminps_avx(auVar199,auVar200);
      auVar115 = vminps_avx(auVar97,auVar115);
      auVar81 = vshufps_avx(auVar81,auVar81,0x55);
      auVar81 = vblendps_avx(auVar81,auVar167,2);
      auVar167 = vpslld_avx(auVar81,0x1f);
      auVar81 = vshufpd_avx(auVar116,auVar116,1);
      auVar81 = vinsertps_avx(auVar81,auVar246,0x9c);
      auVar97 = vshufpd_avx(auVar257,auVar257,1);
      auVar97 = vinsertps_avx(auVar97,auVar229,0x9c);
      auVar81 = vblendvps_avx(auVar97,auVar81,auVar167);
      auVar97 = vmovshdup_avx(auVar81);
      auVar81 = vmaxss_avx(auVar97,auVar81);
      fVar138 = auVar115._0_4_;
      auVar97 = vmovshdup_avx(auVar115);
      fVar196 = auVar81._0_4_;
      fVar94 = auVar158._0_4_;
      if ((0.0001 <= fVar138) || (fVar196 <= -0.0001)) {
        auVar257 = vcmpps_avx(auVar97,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar116 = vcmpps_avx(auVar115,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar257 = vorps_avx(auVar116,auVar257);
        if ((-0.0001 < fVar94 & auVar257[0]) != 0) goto LAB_017eb99a;
        auVar257 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar81,5);
        auVar116 = vcmpps_avx(auVar97,SUB6416(ZEXT464(0x38d1b717),0),5);
        auVar257 = vorps_avx(auVar116,auVar257);
        if ((auVar257 & (undefined1  [16])0x1) == (undefined1  [16])0x0) goto LAB_017eb99a;
LAB_017ec4cb:
        bVar51 = true;
      }
      else {
LAB_017eb99a:
        auVar116 = vcmpps_avx(auVar115,_DAT_01feba10,1);
        auVar167 = SUB6416(ZEXT864(0),0) << 0x20;
        auVar257 = vcmpss_avx(auVar158,ZEXT816(0) << 0x20,1);
        auVar189._8_4_ = 0x3f800000;
        auVar189._0_8_ = &DAT_3f8000003f800000;
        auVar189._12_4_ = 0x3f800000;
        auVar256._8_4_ = 0xbf800000;
        auVar256._0_8_ = 0xbf800000bf800000;
        auVar256._12_4_ = 0xbf800000;
        auVar257 = vblendvps_avx(auVar189,auVar256,auVar257);
        auVar116 = vblendvps_avx(auVar189,auVar256,auVar116);
        fVar114 = auVar116._0_4_;
        fVar134 = auVar257._0_4_;
        auVar257 = SUB6416(ZEXT864(0),0) << 0x20;
        if ((fVar114 == fVar134) && (!NAN(fVar114) && !NAN(fVar134))) {
          auVar257 = SUB6416(ZEXT464(0x7f800000),0);
        }
        if ((fVar114 == fVar134) && (!NAN(fVar114) && !NAN(fVar134))) {
          auVar167 = SUB6416(ZEXT464(0xff800000),0);
        }
        auVar116 = vmovshdup_avx(auVar116);
        fVar135 = auVar116._0_4_;
        auVar116 = SUB6416(ZEXT464(0x3f800000),0);
        if ((fVar114 != fVar135) || (NAN(fVar114) || NAN(fVar135))) {
          fVar114 = auVar97._0_4_;
          if ((fVar114 != fVar138) || (NAN(fVar114) || NAN(fVar138))) {
            auVar125._0_8_ = auVar115._0_8_ ^ 0x8000000080000000;
            auVar125._8_4_ = auVar115._8_4_ ^ 0x80000000;
            auVar125._12_4_ = auVar115._12_4_ ^ 0x80000000;
            auVar168._0_4_ = -fVar138 / (fVar114 - fVar138);
            auVar168._4_12_ = auVar125._4_12_;
            auVar53._12_4_ = 0;
            auVar53._0_12_ = ZEXT812(0);
            auVar190._12_4_ = 0;
            auVar190._0_12_ = ZEXT812(0);
            auVar190 = auVar190 << 0x20;
            auVar97 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar168._0_4_)),auVar53 << 0x20,auVar168
                                     );
            auVar115 = auVar97;
          }
          else {
            auVar97 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar138 == 0.0) && (auVar97 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar138))) {
              auVar97 = ZEXT816(0);
            }
            auVar190 = ZEXT816(0) << 0x20;
            auVar115 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar138 == 0.0) && (auVar115 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar138))) {
              auVar115 = auVar116;
            }
          }
          auVar257 = vminss_avx(auVar257,auVar97);
          auVar167 = vmaxss_avx(auVar115,auVar167);
        }
        else {
          auVar190 = ZEXT816(0) << 0x20;
        }
        auVar81 = vcmpss_avx(auVar81,auVar190,1);
        auVar169._8_4_ = 0x3f800000;
        auVar169._0_8_ = &DAT_3f8000003f800000;
        auVar169._12_4_ = 0x3f800000;
        auVar310._8_4_ = 0xbf800000;
        auVar310._0_8_ = 0xbf800000bf800000;
        auVar310._12_4_ = 0xbf800000;
        auVar81 = vblendvps_avx(auVar169,auVar310,auVar81);
        fVar138 = auVar81._0_4_;
        if ((fVar134 != fVar138) || (NAN(fVar134) || NAN(fVar138))) {
          if ((fVar196 != fVar94) || (NAN(fVar196) || NAN(fVar94))) {
            auVar126._0_8_ = auVar158._0_8_ ^ 0x8000000080000000;
            auVar126._8_4_ = auVar158._8_4_ ^ 0x80000000;
            auVar126._12_4_ = auVar158._12_4_ ^ 0x80000000;
            auVar170._0_4_ = -fVar94 / (fVar196 - fVar94);
            auVar170._4_12_ = auVar126._4_12_;
            auVar81 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar170._0_4_)),auVar190,auVar170);
            auVar97 = auVar81;
          }
          else {
            auVar81 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar94 == 0.0) && (auVar81 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar94))) {
              auVar81 = ZEXT816(0);
            }
            auVar97 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar94 == 0.0) && (auVar97 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar94))) {
              auVar97 = auVar116;
            }
          }
          auVar257 = vminss_avx(auVar257,auVar81);
          auVar167 = vmaxss_avx(auVar97,auVar167);
        }
        if ((fVar135 != fVar138) || (NAN(fVar135) || NAN(fVar138))) {
          auVar257 = vminss_avx(auVar257,auVar116);
          auVar167 = vmaxss_avx(auVar116,auVar167);
        }
        auVar81 = vmaxss_avx(auVar190,auVar257);
        auVar97 = vminss_avx(auVar167,auVar116);
        bVar51 = true;
        if (auVar81._0_4_ <= auVar97._0_4_) {
          auVar81 = vmaxss_avx(auVar190,ZEXT416((uint)(auVar81._0_4_ + -0.1)));
          auVar97 = vminss_avx(ZEXT416((uint)(auVar97._0_4_ + 0.1)),auVar116);
          auVar106._0_8_ = auVar117._0_8_;
          auVar106._8_8_ = auVar106._0_8_;
          auVar258._8_8_ = auVar285._0_8_;
          auVar258._0_8_ = auVar285._0_8_;
          auVar274._8_8_ = auVar201._0_8_;
          auVar274._0_8_ = auVar201._0_8_;
          auVar115 = vshufpd_avx(auVar285,auVar285,3);
          auVar257 = vshufpd_avx(auVar201,auVar201,3);
          auVar116 = vshufps_avx(auVar81,auVar97,0);
          auVar147._8_4_ = 0x3f800000;
          auVar147._0_8_ = &DAT_3f8000003f800000;
          auVar147._12_4_ = 0x3f800000;
          auVar117 = vsubps_avx(auVar147,auVar116);
          local_5d8._0_4_ = auVar79._0_4_;
          local_5d8._4_4_ = auVar79._4_4_;
          fStack_5d0 = auVar79._8_4_;
          fStack_5cc = auVar79._12_4_;
          fVar94 = auVar116._0_4_;
          auVar148._0_4_ = fVar94 * (float)local_5d8._0_4_;
          fVar196 = auVar116._4_4_;
          auVar148._4_4_ = fVar196 * (float)local_5d8._4_4_;
          fVar138 = auVar116._8_4_;
          auVar148._8_4_ = fVar138 * fStack_5d0;
          fVar114 = auVar116._12_4_;
          auVar148._12_4_ = fVar114 * fStack_5cc;
          auVar171._0_4_ = auVar115._0_4_ * fVar94;
          auVar171._4_4_ = auVar115._4_4_ * fVar196;
          auVar171._8_4_ = auVar115._8_4_ * fVar138;
          auVar171._12_4_ = auVar115._12_4_ * fVar114;
          auVar191._0_4_ = auVar257._0_4_ * fVar94;
          auVar191._4_4_ = auVar257._4_4_ * fVar196;
          auVar191._8_4_ = auVar257._8_4_ * fVar138;
          auVar191._12_4_ = auVar257._12_4_ * fVar114;
          local_648._0_4_ = auVar80._0_4_;
          local_648._4_4_ = auVar80._4_4_;
          uStack_640._0_4_ = auVar80._8_4_;
          uStack_640._4_4_ = auVar80._12_4_;
          auVar216._0_4_ = fVar94 * (float)local_648._0_4_;
          auVar216._4_4_ = fVar196 * (float)local_648._4_4_;
          auVar216._8_4_ = fVar138 * (float)uStack_640;
          auVar216._12_4_ = fVar114 * uStack_640._4_4_;
          auVar115 = vfmadd231ps_fma(auVar148,auVar117,auVar106);
          auVar257 = vfmadd231ps_fma(auVar171,auVar117,auVar258);
          auVar116 = vfmadd231ps_fma(auVar191,auVar117,auVar274);
          auVar117 = vfmadd231ps_fma(auVar216,auVar117,ZEXT816(0));
          auVar79 = vmovshdup_avx(local_658);
          auVar199 = vfmadd231ss_fma(ZEXT416((uint)(auVar79._0_4_ * auVar81._0_4_)),local_658,
                                     ZEXT416((uint)(1.0 - auVar81._0_4_)));
          auVar200 = vfmadd231ss_fma(ZEXT416((uint)(auVar79._0_4_ * auVar97._0_4_)),local_658,
                                     ZEXT416((uint)(1.0 - auVar97._0_4_)));
          fVar94 = 1.0 / fVar177;
          auVar81 = vsubps_avx(auVar257,auVar115);
          auVar238._0_4_ = auVar81._0_4_ * 3.0;
          auVar238._4_4_ = auVar81._4_4_ * 3.0;
          auVar238._8_4_ = auVar81._8_4_ * 3.0;
          auVar238._12_4_ = auVar81._12_4_ * 3.0;
          auVar81 = vsubps_avx(auVar116,auVar257);
          auVar259._0_4_ = auVar81._0_4_ * 3.0;
          auVar259._4_4_ = auVar81._4_4_ * 3.0;
          auVar259._8_4_ = auVar81._8_4_ * 3.0;
          auVar259._12_4_ = auVar81._12_4_ * 3.0;
          auVar81 = vsubps_avx(auVar117,auVar116);
          auVar275._0_4_ = auVar81._0_4_ * 3.0;
          auVar275._4_4_ = auVar81._4_4_ * 3.0;
          auVar275._8_4_ = auVar81._8_4_ * 3.0;
          auVar275._12_4_ = auVar81._12_4_ * 3.0;
          auVar79 = vminps_avx(auVar259,auVar275);
          auVar81 = vmaxps_avx(auVar259,auVar275);
          auVar79 = vminps_avx(auVar238,auVar79);
          auVar81 = vmaxps_avx(auVar238,auVar81);
          auVar80 = vshufpd_avx(auVar79,auVar79,3);
          auVar97 = vshufpd_avx(auVar81,auVar81,3);
          auVar79 = vminps_avx(auVar79,auVar80);
          auVar81 = vmaxps_avx(auVar81,auVar97);
          auVar260._0_4_ = auVar79._0_4_ * fVar94;
          auVar260._4_4_ = auVar79._4_4_ * fVar94;
          auVar260._8_4_ = auVar79._8_4_ * fVar94;
          auVar260._12_4_ = auVar79._12_4_ * fVar94;
          auVar239._0_4_ = fVar94 * auVar81._0_4_;
          auVar239._4_4_ = fVar94 * auVar81._4_4_;
          auVar239._8_4_ = fVar94 * auVar81._8_4_;
          auVar239._12_4_ = fVar94 * auVar81._12_4_;
          fVar94 = 1.0 / (auVar200._0_4_ - auVar199._0_4_);
          auVar81 = vshufpd_avx(auVar115,auVar115,3);
          auVar79 = vshufpd_avx(auVar257,auVar257,3);
          auVar80 = vshufpd_avx(auVar116,auVar116,3);
          auVar97 = vshufpd_avx(auVar117,auVar117,3);
          auVar81 = vsubps_avx(auVar81,auVar115);
          auVar115 = vsubps_avx(auVar79,auVar257);
          auVar257 = vsubps_avx(auVar80,auVar116);
          auVar97 = vsubps_avx(auVar97,auVar117);
          auVar79 = vminps_avx(auVar81,auVar115);
          auVar81 = vmaxps_avx(auVar81,auVar115);
          auVar80 = vminps_avx(auVar257,auVar97);
          auVar80 = vminps_avx(auVar79,auVar80);
          auVar79 = vmaxps_avx(auVar257,auVar97);
          auVar81 = vmaxps_avx(auVar81,auVar79);
          auVar300._0_4_ = fVar94 * auVar80._0_4_;
          auVar300._4_4_ = fVar94 * auVar80._4_4_;
          auVar300._8_4_ = fVar94 * auVar80._8_4_;
          auVar300._12_4_ = fVar94 * auVar80._12_4_;
          auVar286._0_4_ = fVar94 * auVar81._0_4_;
          auVar286._4_4_ = fVar94 * auVar81._4_4_;
          auVar286._8_4_ = fVar94 * auVar81._8_4_;
          auVar286._12_4_ = fVar94 * auVar81._12_4_;
          auVar97 = vinsertps_avx(auVar16,auVar199,0x10);
          auVar115 = vinsertps_avx(auVar91,auVar200,0x10);
          auVar90._0_4_ = (auVar97._0_4_ + auVar115._0_4_) * 0.5;
          auVar90._4_4_ = (auVar97._4_4_ + auVar115._4_4_) * 0.5;
          auVar90._8_4_ = (auVar97._8_4_ + auVar115._8_4_) * 0.5;
          auVar90._12_4_ = (auVar97._12_4_ + auVar115._12_4_) * 0.5;
          auVar149._4_4_ = auVar90._0_4_;
          auVar149._0_4_ = auVar90._0_4_;
          auVar149._8_4_ = auVar90._0_4_;
          auVar149._12_4_ = auVar90._0_4_;
          auVar81 = vfmadd213ps_fma(auVar14,auVar149,auVar17);
          auVar79 = vfmadd213ps_fma(auVar15,auVar149,auVar18);
          auVar80 = vfmadd213ps_fma(local_278,auVar149,auVar184);
          auVar91 = vsubps_avx(auVar79,auVar81);
          auVar81 = vfmadd213ps_fma(auVar91,auVar149,auVar81);
          auVar91 = vsubps_avx(auVar80,auVar79);
          auVar91 = vfmadd213ps_fma(auVar91,auVar149,auVar79);
          auVar91 = vsubps_avx(auVar91,auVar81);
          auVar81 = vfmadd231ps_fma(auVar81,auVar91,auVar149);
          auVar150._0_8_ = CONCAT44(auVar91._4_4_ * 3.0,auVar91._0_4_ * 3.0);
          auVar150._8_4_ = auVar91._8_4_ * 3.0;
          auVar150._12_4_ = auVar91._12_4_ * 3.0;
          auVar276._8_8_ = auVar81._0_8_;
          auVar276._0_8_ = auVar81._0_8_;
          auVar91 = vshufpd_avx(auVar81,auVar81,3);
          auVar81 = vshufps_avx(auVar90,auVar90,0x55);
          auVar257 = vsubps_avx(auVar91,auVar276);
          auVar117 = vfmadd231ps_fma(auVar276,auVar81,auVar257);
          auVar325._8_8_ = auVar150._0_8_;
          auVar325._0_8_ = auVar150._0_8_;
          auVar91 = vshufpd_avx(auVar150,auVar150,3);
          auVar91 = vsubps_avx(auVar91,auVar325);
          auVar116 = vfmadd213ps_fma(auVar91,auVar81,auVar325);
          auVar81 = vmovshdup_avx(auVar116);
          auVar326._0_8_ = auVar81._0_8_ ^ 0x8000000080000000;
          auVar326._8_4_ = auVar81._8_4_ ^ 0x80000000;
          auVar326._12_4_ = auVar81._12_4_ ^ 0x80000000;
          auVar79 = vmovshdup_avx(auVar257);
          auVar91 = vunpcklps_avx(auVar79,auVar326);
          auVar80 = vshufps_avx(auVar91,auVar326,4);
          auVar347._0_8_ = auVar257._0_8_ ^ 0x8000000080000000;
          auVar347._8_4_ = auVar257._8_4_ ^ 0x80000000;
          auVar347._12_4_ = auVar257._12_4_ ^ 0x80000000;
          auVar91 = vmovlhps_avx(auVar347,auVar116);
          auVar91 = vshufps_avx(auVar91,auVar116,8);
          auVar81 = vfmsub231ss_fma(ZEXT416((uint)(auVar81._0_4_ * auVar257._0_4_)),auVar79,auVar116
                                   );
          auVar172._0_4_ = auVar81._0_4_;
          auVar172._4_4_ = auVar172._0_4_;
          auVar172._8_4_ = auVar172._0_4_;
          auVar172._12_4_ = auVar172._0_4_;
          auVar81 = vdivps_avx(auVar80,auVar172);
          auVar79 = vdivps_avx(auVar91,auVar172);
          fVar138 = auVar117._0_4_;
          fVar94 = auVar81._0_4_;
          auVar91 = vshufps_avx(auVar117,auVar117,0x55);
          fVar196 = auVar79._0_4_;
          local_648._4_4_ = fVar138 * auVar81._4_4_ + auVar91._4_4_ * auVar79._4_4_;
          local_648._0_4_ = fVar138 * fVar94 + auVar91._0_4_ * fVar196;
          uStack_640._0_4_ = fVar138 * auVar81._8_4_ + auVar91._8_4_ * auVar79._8_4_;
          uStack_640._4_4_ = fVar138 * auVar81._12_4_ + auVar91._12_4_ * auVar79._12_4_;
          auVar257 = vmovshdup_avx(auVar81);
          auVar91 = vinsertps_avx(auVar260,auVar300,0x1c);
          auVar339._0_4_ = auVar257._0_4_ * auVar91._0_4_;
          auVar339._4_4_ = auVar257._4_4_ * auVar91._4_4_;
          auVar339._8_4_ = auVar257._8_4_ * auVar91._8_4_;
          auVar339._12_4_ = auVar257._12_4_ * auVar91._12_4_;
          auVar80 = vinsertps_avx(auVar239,auVar286,0x1c);
          auVar311._0_4_ = auVar257._0_4_ * auVar80._0_4_;
          auVar311._4_4_ = auVar257._4_4_ * auVar80._4_4_;
          auVar311._8_4_ = auVar257._8_4_ * auVar80._8_4_;
          auVar311._12_4_ = auVar257._12_4_ * auVar80._12_4_;
          auVar158 = vminps_avx(auVar339,auVar311);
          auVar117 = vmaxps_avx(auVar311,auVar339);
          auVar257 = vinsertps_avx(auVar300,auVar260,0x4c);
          auVar167 = vmovshdup_avx(auVar79);
          auVar116 = vinsertps_avx(auVar286,auVar239,0x4c);
          auVar287._0_4_ = auVar167._0_4_ * auVar257._0_4_;
          auVar287._4_4_ = auVar167._4_4_ * auVar257._4_4_;
          auVar287._8_4_ = auVar167._8_4_ * auVar257._8_4_;
          auVar287._12_4_ = auVar167._12_4_ * auVar257._12_4_;
          auVar301._0_4_ = auVar167._0_4_ * auVar116._0_4_;
          auVar301._4_4_ = auVar167._4_4_ * auVar116._4_4_;
          auVar301._8_4_ = auVar167._8_4_ * auVar116._8_4_;
          auVar301._12_4_ = auVar167._12_4_ * auVar116._12_4_;
          auVar167 = vminps_avx(auVar287,auVar301);
          auVar107._0_4_ = auVar167._0_4_ + auVar158._0_4_;
          auVar107._4_4_ = auVar167._4_4_ + auVar158._4_4_;
          auVar107._8_4_ = auVar167._8_4_ + auVar158._8_4_;
          auVar107._12_4_ = auVar167._12_4_ + auVar158._12_4_;
          auVar158 = vmaxps_avx(auVar301,auVar287);
          auVar288._0_4_ = auVar117._0_4_ + auVar158._0_4_;
          auVar288._4_4_ = auVar117._4_4_ + auVar158._4_4_;
          auVar288._8_4_ = auVar117._8_4_ + auVar158._8_4_;
          auVar288._12_4_ = auVar117._12_4_ + auVar158._12_4_;
          auVar302._8_8_ = 0x3f80000000000000;
          auVar302._0_8_ = 0x3f80000000000000;
          auVar117 = vsubps_avx(auVar302,auVar288);
          auVar158 = vsubps_avx(auVar302,auVar107);
          auVar167 = vsubps_avx(auVar97,auVar90);
          auVar327._0_4_ = fVar94 * auVar91._0_4_;
          auVar327._4_4_ = fVar94 * auVar91._4_4_;
          auVar327._8_4_ = fVar94 * auVar91._8_4_;
          auVar327._12_4_ = fVar94 * auVar91._12_4_;
          auVar312._0_4_ = fVar94 * auVar80._0_4_;
          auVar312._4_4_ = fVar94 * auVar80._4_4_;
          auVar312._8_4_ = fVar94 * auVar80._8_4_;
          auVar312._12_4_ = fVar94 * auVar80._12_4_;
          auVar80 = vminps_avx(auVar327,auVar312);
          auVar91 = vmaxps_avx(auVar312,auVar327);
          auVar261._0_4_ = fVar196 * auVar257._0_4_;
          auVar261._4_4_ = fVar196 * auVar257._4_4_;
          auVar261._8_4_ = fVar196 * auVar257._8_4_;
          auVar261._12_4_ = fVar196 * auVar257._12_4_;
          auVar240._0_4_ = fVar196 * auVar116._0_4_;
          auVar240._4_4_ = fVar196 * auVar116._4_4_;
          auVar240._8_4_ = fVar196 * auVar116._8_4_;
          auVar240._12_4_ = fVar196 * auVar116._12_4_;
          auVar257 = vminps_avx(auVar261,auVar240);
          auVar328._0_4_ = auVar80._0_4_ + auVar257._0_4_;
          auVar328._4_4_ = auVar80._4_4_ + auVar257._4_4_;
          auVar328._8_4_ = auVar80._8_4_ + auVar257._8_4_;
          auVar328._12_4_ = auVar80._12_4_ + auVar257._12_4_;
          auVar257 = vsubps_avx(auVar115,auVar90);
          auVar80 = vmaxps_avx(auVar240,auVar261);
          fVar138 = auVar167._0_4_;
          auVar262._0_4_ = fVar138 * auVar117._0_4_;
          fVar114 = auVar167._4_4_;
          auVar262._4_4_ = fVar114 * auVar117._4_4_;
          fVar134 = auVar167._8_4_;
          auVar262._8_4_ = fVar134 * auVar117._8_4_;
          fVar135 = auVar167._12_4_;
          auVar262._12_4_ = fVar135 * auVar117._12_4_;
          auVar241._0_4_ = auVar91._0_4_ + auVar80._0_4_;
          auVar241._4_4_ = auVar91._4_4_ + auVar80._4_4_;
          auVar241._8_4_ = auVar91._8_4_ + auVar80._8_4_;
          auVar241._12_4_ = auVar91._12_4_ + auVar80._12_4_;
          auVar313._8_8_ = 0x3f800000;
          auVar313._0_8_ = 0x3f800000;
          auVar91 = vsubps_avx(auVar313,auVar241);
          auVar80 = vsubps_avx(auVar313,auVar328);
          auVar329._0_4_ = fVar138 * auVar158._0_4_;
          auVar329._4_4_ = fVar114 * auVar158._4_4_;
          auVar329._8_4_ = fVar134 * auVar158._8_4_;
          auVar329._12_4_ = fVar135 * auVar158._12_4_;
          fVar155 = auVar257._0_4_;
          auVar289._0_4_ = fVar155 * auVar117._0_4_;
          fVar156 = auVar257._4_4_;
          auVar289._4_4_ = fVar156 * auVar117._4_4_;
          fVar157 = auVar257._8_4_;
          auVar289._8_4_ = fVar157 * auVar117._8_4_;
          fVar280 = auVar257._12_4_;
          auVar289._12_4_ = fVar280 * auVar117._12_4_;
          auVar108._0_4_ = fVar155 * auVar158._0_4_;
          auVar108._4_4_ = fVar156 * auVar158._4_4_;
          auVar108._8_4_ = fVar157 * auVar158._8_4_;
          auVar108._12_4_ = fVar280 * auVar158._12_4_;
          auVar348._0_4_ = fVar138 * auVar91._0_4_;
          auVar348._4_4_ = fVar114 * auVar91._4_4_;
          auVar348._8_4_ = fVar134 * auVar91._8_4_;
          auVar348._12_4_ = fVar135 * auVar91._12_4_;
          auVar303._0_4_ = fVar138 * auVar80._0_4_;
          auVar303._4_4_ = fVar114 * auVar80._4_4_;
          auVar303._8_4_ = fVar134 * auVar80._8_4_;
          auVar303._12_4_ = fVar135 * auVar80._12_4_;
          auVar242._0_4_ = fVar155 * auVar91._0_4_;
          auVar242._4_4_ = fVar156 * auVar91._4_4_;
          auVar242._8_4_ = fVar157 * auVar91._8_4_;
          auVar242._12_4_ = fVar280 * auVar91._12_4_;
          auVar314._0_4_ = fVar155 * auVar80._0_4_;
          auVar314._4_4_ = fVar156 * auVar80._4_4_;
          auVar314._8_4_ = fVar157 * auVar80._8_4_;
          auVar314._12_4_ = fVar280 * auVar80._12_4_;
          auVar91 = vminps_avx(auVar348,auVar303);
          auVar80 = vminps_avx(auVar242,auVar314);
          auVar91 = vminps_avx(auVar91,auVar80);
          auVar80 = vmaxps_avx(auVar303,auVar348);
          auVar257 = vminps_avx(auVar262,auVar329);
          auVar116 = vminps_avx(auVar289,auVar108);
          auVar257 = vminps_avx(auVar257,auVar116);
          auVar91 = vhaddps_avx(auVar91,auVar257);
          auVar257 = vmaxps_avx(auVar314,auVar242);
          auVar80 = vmaxps_avx(auVar257,auVar80);
          auVar257 = vmaxps_avx(auVar329,auVar262);
          auVar116 = vmaxps_avx(auVar108,auVar289);
          auVar257 = vmaxps_avx(auVar116,auVar257);
          auVar80 = vhaddps_avx(auVar80,auVar257);
          auVar257 = vshufps_avx(auVar90,auVar90,0x54);
          auVar257 = vsubps_avx(auVar257,_local_648);
          auVar91 = vshufps_avx(auVar91,auVar91,0xe8);
          auVar80 = vshufps_avx(auVar80,auVar80,0xe8);
          auVar263._0_4_ = auVar257._0_4_ + auVar91._0_4_;
          auVar263._4_4_ = auVar257._4_4_ + auVar91._4_4_;
          auVar263._8_4_ = auVar257._8_4_ + auVar91._8_4_;
          auVar263._12_4_ = auVar257._12_4_ + auVar91._12_4_;
          auVar243._0_4_ = auVar257._0_4_ + auVar80._0_4_;
          auVar243._4_4_ = auVar257._4_4_ + auVar80._4_4_;
          auVar243._8_4_ = auVar257._8_4_ + auVar80._8_4_;
          auVar243._12_4_ = auVar257._12_4_ + auVar80._12_4_;
          auVar91 = vmaxps_avx(auVar97,auVar263);
          auVar80 = vminps_avx(auVar243,auVar115);
          auVar91 = vcmpps_avx(auVar80,auVar91,1);
          auVar91 = vshufps_avx(auVar91,auVar91,0x50);
          local_658 = vinsertps_avx(auVar199,ZEXT416((uint)auVar200._0_4_),0x10);
          if ((auVar91 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
              auVar91[0xf] < '\0') goto LAB_017ec4cb;
          bVar71 = 0;
          if ((auVar221._0_4_ < auVar263._0_4_) && (bVar71 = 0, auVar243._0_4_ < auVar115._0_4_)) {
            auVar80 = vmovshdup_avx(auVar263);
            auVar91 = vcmpps_avx(auVar243,auVar115,1);
            bVar71 = auVar91[4] & auVar199._0_4_ < auVar80._0_4_;
          }
          if (((3 < (uint)uVar68 || fVar177 < 0.001) | bVar71) == 1) {
            lVar70 = 200;
            do {
              fVar134 = auVar257._0_4_;
              fVar114 = 1.0 - fVar134;
              fVar177 = fVar114 * fVar114 * fVar114;
              fVar138 = fVar134 * 3.0 * fVar114 * fVar114;
              fVar114 = fVar114 * fVar134 * fVar134 * 3.0;
              auVar192._4_4_ = fVar177;
              auVar192._0_4_ = fVar177;
              auVar192._8_4_ = fVar177;
              auVar192._12_4_ = fVar177;
              auVar127._4_4_ = fVar138;
              auVar127._0_4_ = fVar138;
              auVar127._8_4_ = fVar138;
              auVar127._12_4_ = fVar138;
              auVar109._4_4_ = fVar114;
              auVar109._0_4_ = fVar114;
              auVar109._8_4_ = fVar114;
              auVar109._12_4_ = fVar114;
              fVar134 = fVar134 * fVar134 * fVar134;
              auVar217._0_4_ = (float)local_3f8._0_4_ * fVar134;
              auVar217._4_4_ = (float)local_3f8._4_4_ * fVar134;
              auVar217._8_4_ = fStack_3f0 * fVar134;
              auVar217._12_4_ = fStack_3ec * fVar134;
              auVar91 = vfmadd231ps_fma(auVar217,auVar184,auVar109);
              auVar91 = vfmadd231ps_fma(auVar91,auVar18,auVar127);
              auVar91 = vfmadd231ps_fma(auVar91,auVar17,auVar192);
              auVar110._8_8_ = auVar91._0_8_;
              auVar110._0_8_ = auVar91._0_8_;
              auVar91 = vshufpd_avx(auVar91,auVar91,3);
              auVar80 = vshufps_avx(auVar257,auVar257,0x55);
              auVar91 = vsubps_avx(auVar91,auVar110);
              auVar80 = vfmadd213ps_fma(auVar91,auVar80,auVar110);
              fVar177 = auVar80._0_4_;
              auVar91 = vshufps_avx(auVar80,auVar80,0x55);
              auVar111._0_4_ = fVar94 * fVar177 + fVar196 * auVar91._0_4_;
              auVar111._4_4_ = auVar81._4_4_ * fVar177 + auVar79._4_4_ * auVar91._4_4_;
              auVar111._8_4_ = auVar81._8_4_ * fVar177 + auVar79._8_4_ * auVar91._8_4_;
              auVar111._12_4_ = auVar81._12_4_ * fVar177 + auVar79._12_4_ * auVar91._12_4_;
              auVar257 = vsubps_avx(auVar257,auVar111);
              auVar91 = vandps_avx(auVar335,auVar80);
              auVar80 = vshufps_avx(auVar91,auVar91,0xf5);
              auVar91 = vmaxss_avx(auVar80,auVar91);
              if (auVar91._0_4_ < (float)local_288._0_4_) {
                local_1f8 = auVar257._0_4_;
                if ((0.0 <= local_1f8) && (local_1f8 <= 1.0)) {
                  auVar91 = vmovshdup_avx(auVar257);
                  fVar177 = auVar91._0_4_;
                  if ((0.0 <= fVar177) && (fVar177 <= 1.0)) {
                    auVar91 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                            ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c
                                           );
                    auVar117 = vinsertps_avx(auVar91,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128
                                                                   [2]),0x28);
                    auVar91 = vdpps_avx(auVar117,local_408,0x7f);
                    auVar81 = vdpps_avx(auVar117,local_418,0x7f);
                    auVar79 = vdpps_avx(auVar117,local_298,0x7f);
                    auVar80 = vdpps_avx(auVar117,local_2a8,0x7f);
                    auVar97 = vdpps_avx(auVar117,local_2b8,0x7f);
                    auVar115 = vdpps_avx(auVar117,local_2c8,0x7f);
                    auVar116 = vdpps_avx(auVar117,local_2d8,0x7f);
                    auVar117 = vdpps_avx(auVar117,local_2e8,0x7f);
                    fVar94 = 1.0 - fVar177;
                    auVar91 = vfmadd231ss_fma(ZEXT416((uint)(fVar177 * auVar97._0_4_)),
                                              ZEXT416((uint)fVar94),auVar91);
                    auVar81 = vfmadd231ss_fma(ZEXT416((uint)(auVar115._0_4_ * fVar177)),
                                              ZEXT416((uint)fVar94),auVar81);
                    auVar79 = vfmadd231ss_fma(ZEXT416((uint)(auVar116._0_4_ * fVar177)),
                                              ZEXT416((uint)fVar94),auVar79);
                    auVar80 = vfmadd231ss_fma(ZEXT416((uint)(fVar177 * auVar117._0_4_)),
                                              ZEXT416((uint)fVar94),auVar80);
                    fVar138 = 1.0 - local_1f8;
                    fVar177 = fVar138 * local_1f8 * local_1f8 * 3.0;
                    fVar134 = local_1f8 * local_1f8 * local_1f8;
                    auVar79 = vfmadd231ss_fma(ZEXT416((uint)(auVar80._0_4_ * fVar134)),
                                              ZEXT416((uint)fVar177),auVar79);
                    fVar94 = local_1f8 * 3.0 * fVar138 * fVar138;
                    auVar81 = vfmadd231ss_fma(auVar79,ZEXT416((uint)fVar94),auVar81);
                    fVar196 = fVar138 * fVar138 * fVar138;
                    auVar91 = vfmadd231ss_fma(auVar81,ZEXT416((uint)fVar196),auVar91);
                    fVar114 = auVar91._0_4_;
                    if ((fVar77 <= fVar114) &&
                       (fVar135 = *(float *)(ray + k * 4 + 0x80), fVar114 <= fVar135)) {
                      pGVar7 = (context->scene->geometries).items[uVar67].ptr;
                      if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                        bVar76 = false;
                      }
                      else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                              (bVar76 = true, pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0))
                      {
                        local_1e8 = vshufps_avx(auVar257,auVar257,0x55);
                        auVar264._8_4_ = 0x3f800000;
                        auVar264._0_8_ = &DAT_3f8000003f800000;
                        auVar264._12_4_ = 0x3f800000;
                        auVar91 = vsubps_avx(auVar264,local_1e8);
                        fVar155 = local_1e8._0_4_;
                        auVar277._0_4_ = fVar155 * (float)local_448._0_4_;
                        fVar156 = local_1e8._4_4_;
                        auVar277._4_4_ = fVar156 * (float)local_448._4_4_;
                        fVar157 = local_1e8._8_4_;
                        auVar277._8_4_ = fVar157 * fStack_440;
                        fVar280 = local_1e8._12_4_;
                        auVar277._12_4_ = fVar280 * fStack_43c;
                        auVar290._0_4_ = fVar155 * (float)local_458._0_4_;
                        auVar290._4_4_ = fVar156 * (float)local_458._4_4_;
                        auVar290._8_4_ = fVar157 * fStack_450;
                        auVar290._12_4_ = fVar280 * fStack_44c;
                        local_4d8 = auVar20._0_4_;
                        fStack_4d4 = auVar20._4_4_;
                        fStack_4d0 = auVar20._8_4_;
                        fStack_4cc = auVar20._12_4_;
                        auVar304._0_4_ = fVar155 * local_4d8;
                        auVar304._4_4_ = fVar156 * fStack_4d4;
                        auVar304._8_4_ = fVar157 * fStack_4d0;
                        auVar304._12_4_ = fVar280 * fStack_4cc;
                        local_4e8 = auVar21._0_4_;
                        fStack_4e4 = auVar21._4_4_;
                        fStack_4e0 = auVar21._8_4_;
                        fStack_4dc = auVar21._12_4_;
                        auVar315._0_4_ = fVar155 * local_4e8;
                        auVar315._4_4_ = fVar156 * fStack_4e4;
                        auVar315._8_4_ = fVar157 * fStack_4e0;
                        auVar315._12_4_ = fVar280 * fStack_4dc;
                        auVar81 = vfmadd231ps_fma(auVar277,auVar91,local_428);
                        auVar79 = vfmadd231ps_fma(auVar290,auVar91,auVar19);
                        auVar80 = vfmadd231ps_fma(auVar304,auVar91,local_438);
                        auVar97 = vfmadd231ps_fma(auVar315,auVar91,auVar181);
                        auVar91 = vsubps_avx(auVar79,auVar81);
                        auVar81 = vsubps_avx(auVar80,auVar79);
                        auVar79 = vsubps_avx(auVar97,auVar80);
                        auVar305._0_4_ = auVar81._0_4_ * local_1f8;
                        auVar305._4_4_ = auVar81._4_4_ * local_1f8;
                        auVar305._8_4_ = auVar81._8_4_ * local_1f8;
                        auVar305._12_4_ = auVar81._12_4_ * local_1f8;
                        auVar218._4_4_ = fVar138;
                        auVar218._0_4_ = fVar138;
                        auVar218._8_4_ = fVar138;
                        auVar218._12_4_ = fVar138;
                        auVar91 = vfmadd231ps_fma(auVar305,auVar218,auVar91);
                        auVar265._0_4_ = auVar79._0_4_ * local_1f8;
                        auVar265._4_4_ = auVar79._4_4_ * local_1f8;
                        auVar265._8_4_ = auVar79._8_4_ * local_1f8;
                        auVar265._12_4_ = auVar79._12_4_ * local_1f8;
                        auVar81 = vfmadd231ps_fma(auVar265,auVar218,auVar81);
                        auVar266._0_4_ = auVar81._0_4_ * local_1f8;
                        auVar266._4_4_ = auVar81._4_4_ * local_1f8;
                        auVar266._8_4_ = auVar81._8_4_ * local_1f8;
                        auVar266._12_4_ = auVar81._12_4_ * local_1f8;
                        auVar81 = vfmadd231ps_fma(auVar266,auVar218,auVar91);
                        auVar193._0_4_ = fVar134 * (float)local_368._0_4_;
                        auVar193._4_4_ = fVar134 * (float)local_368._4_4_;
                        auVar193._8_4_ = fVar134 * fStack_360;
                        auVar193._12_4_ = fVar134 * fStack_35c;
                        auVar128._4_4_ = fVar177;
                        auVar128._0_4_ = fVar177;
                        auVar128._8_4_ = fVar177;
                        auVar128._12_4_ = fVar177;
                        auVar91 = vfmadd132ps_fma(auVar128,auVar193,local_358);
                        auVar173._4_4_ = fVar94;
                        auVar173._0_4_ = fVar94;
                        auVar173._8_4_ = fVar94;
                        auVar173._12_4_ = fVar94;
                        auVar91 = vfmadd132ps_fma(auVar173,auVar91,local_348);
                        auVar129._0_4_ = auVar81._0_4_ * 3.0;
                        auVar129._4_4_ = auVar81._4_4_ * 3.0;
                        auVar129._8_4_ = auVar81._8_4_ * 3.0;
                        auVar129._12_4_ = auVar81._12_4_ * 3.0;
                        auVar151._4_4_ = fVar196;
                        auVar151._0_4_ = fVar196;
                        auVar151._8_4_ = fVar196;
                        auVar151._12_4_ = fVar196;
                        auVar81 = vfmadd132ps_fma(auVar151,auVar91,local_338);
                        auVar91 = vshufps_avx(auVar129,auVar129,0xc9);
                        auVar174._0_4_ = auVar81._0_4_ * auVar91._0_4_;
                        auVar174._4_4_ = auVar81._4_4_ * auVar91._4_4_;
                        auVar174._8_4_ = auVar81._8_4_ * auVar91._8_4_;
                        auVar174._12_4_ = auVar81._12_4_ * auVar91._12_4_;
                        auVar91 = vshufps_avx(auVar81,auVar81,0xc9);
                        auVar81 = vfmsub231ps_fma(auVar174,auVar129,auVar91);
                        auVar91 = vshufps_avx(auVar81,auVar81,0x55);
                        local_228[0] = (RTCHitN)auVar91[0];
                        local_228[1] = (RTCHitN)auVar91[1];
                        local_228[2] = (RTCHitN)auVar91[2];
                        local_228[3] = (RTCHitN)auVar91[3];
                        local_228[4] = (RTCHitN)auVar91[4];
                        local_228[5] = (RTCHitN)auVar91[5];
                        local_228[6] = (RTCHitN)auVar91[6];
                        local_228[7] = (RTCHitN)auVar91[7];
                        local_228[8] = (RTCHitN)auVar91[8];
                        local_228[9] = (RTCHitN)auVar91[9];
                        local_228[10] = (RTCHitN)auVar91[10];
                        local_228[0xb] = (RTCHitN)auVar91[0xb];
                        local_228[0xc] = (RTCHitN)auVar91[0xc];
                        local_228[0xd] = (RTCHitN)auVar91[0xd];
                        local_228[0xe] = (RTCHitN)auVar91[0xe];
                        local_228[0xf] = (RTCHitN)auVar91[0xf];
                        local_218 = vshufps_avx(auVar81,auVar81,0xaa);
                        local_208 = auVar81._0_4_;
                        uStack_204 = local_208;
                        uStack_200 = local_208;
                        uStack_1fc = local_208;
                        fStack_1f4 = local_1f8;
                        fStack_1f0 = local_1f8;
                        fStack_1ec = local_1f8;
                        local_1d8 = CONCAT44(uStack_324,local_328);
                        uStack_1d0 = CONCAT44(uStack_31c,uStack_320);
                        local_1c8._4_4_ = uStack_314;
                        local_1c8._0_4_ = local_318;
                        local_1c8._8_4_ = uStack_310;
                        local_1c8._12_4_ = uStack_30c;
                        vpcmpeqd_avx2(ZEXT1632(local_1c8),ZEXT1632(local_1c8));
                        uStack_1b4 = context->user->instID[0];
                        local_1b8 = uStack_1b4;
                        uStack_1b0 = uStack_1b4;
                        uStack_1ac = uStack_1b4;
                        uStack_1a8 = context->user->instPrimID[0];
                        uStack_1a4 = uStack_1a8;
                        uStack_1a0 = uStack_1a8;
                        uStack_19c = uStack_1a8;
                        *(float *)(ray + k * 4 + 0x80) = fVar114;
                        local_478 = *local_468;
                        uStack_470 = local_468[1];
                        local_3b8.valid = (int *)&local_478;
                        local_3b8.geometryUserPtr = pGVar7->userPtr;
                        local_3b8.context = context->user;
                        local_3b8.ray = (RTCRayN *)ray;
                        local_3b8.hit = local_228;
                        local_3b8.N = 4;
                        local_388._0_4_ = (int)uVar74;
                        if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar7->occlusionFilterN)(&local_3b8);
                          uVar74 = (ulong)(uint)local_388._0_4_;
                        }
                        auVar56._8_8_ = uStack_470;
                        auVar56._0_8_ = local_478;
                        if (auVar56 == (undefined1  [16])0x0) {
                          auVar91 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                          auVar91 = auVar91 ^ _DAT_01febe20;
                        }
                        else {
                          p_Var13 = context->args->filter;
                          if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var13)(&local_3b8);
                            uVar74 = (ulong)(uint)local_388._0_4_;
                          }
                          auVar57._8_8_ = uStack_470;
                          auVar57._0_8_ = local_478;
                          auVar81 = vpcmpeqd_avx((undefined1  [16])0x0,auVar57);
                          auVar91 = auVar81 ^ _DAT_01febe20;
                          auVar130._8_4_ = 0xff800000;
                          auVar130._0_8_ = 0xff800000ff800000;
                          auVar130._12_4_ = 0xff800000;
                          auVar81 = vblendvps_avx(auVar130,*(undefined1 (*) [16])
                                                            (local_3b8.ray + 0x80),auVar81);
                          *(undefined1 (*) [16])(local_3b8.ray + 0x80) = auVar81;
                        }
                        auVar91 = vpslld_avx(auVar91,0x1f);
                        iVar66 = vmovmskps_avx(auVar91);
                        if (iVar66 == 0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar135;
                        }
                        bVar76 = (char)iVar66 != '\0';
                      }
                      uVar74 = CONCAT71((int7)(uVar74 >> 8),(byte)uVar74 | bVar76);
                    }
                  }
                }
                break;
              }
              lVar70 = lVar70 + -1;
            } while (lVar70 != 0);
          }
          else {
            bVar51 = false;
          }
        }
      }
    } while (bVar51);
    local_2f8 = vinsertps_avx(auVar16,ZEXT416((uint)fVar195),0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }